

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxlpbase_real.hpp
# Opt level: O1

bool __thiscall
soplex::
SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::readMPS(SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          *this,istream *p_input,NameSet *p_rnames,NameSet *p_cnames,DIdxSet *p_intvars)

{
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pVVar1;
  LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *this_00;
  DataKey *pDVar2;
  uint *puVar3;
  undefined8 *puVar4;
  char cVar5;
  ostream *poVar6;
  _func_int **pp_Var7;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  undefined8 uVar12;
  undefined8 uVar13;
  undefined8 uVar14;
  int32_t iVar15;
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  NameSet *pNVar18;
  bool bVar19;
  int iVar20;
  int i;
  int iVar21;
  uint uVar22;
  char *pcVar23;
  cpp_dec_float<100U,_int,_void> *pcVar24;
  size_t sVar25;
  ulong uVar26;
  pointer pnVar27;
  SPxOut *pSVar28;
  int __c;
  long in_FS_OFFSET;
  double dVar29;
  LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *rset;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  val_1;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  val;
  NameSet *rnames;
  Verbosity old_verbosity;
  DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  vec;
  char rhsname [256];
  MPSInput mps;
  undefined1 local_6f8 [16];
  undefined1 local_6e8 [16];
  undefined1 local_6d8 [16];
  _func_int *local_6c8;
  uint uStack_6c0;
  undefined3 uStack_6bb;
  int iStack_6b8;
  bool bStack_6b4;
  undefined8 local_6b0;
  undefined1 local_6a8 [16];
  undefined1 local_698 [16];
  undefined1 local_688 [16];
  _func_int *local_678;
  uint uStack_670;
  undefined3 uStack_66b;
  int iStack_668;
  bool bStack_664;
  undefined8 local_660;
  SPxOut *local_650;
  NameSet *local_648;
  NameSet *local_640;
  NameSet *local_638;
  undefined8 uStack_630;
  NameSet *local_628;
  undefined8 uStack_620;
  DIdxSet *local_610;
  undefined1 local_608 [16];
  undefined1 local_5f8 [16];
  undefined1 local_5e8 [16];
  _func_int *local_5d8;
  uint uStack_5d0;
  undefined3 uStack_5cb;
  int iStack_5c8;
  bool bStack_5c4;
  undefined8 local_5c0;
  undefined1 local_509;
  undefined1 local_500 [8];
  SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  local_4f8;
  Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *local_4e8;
  LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *local_4e0;
  NameSet *local_4d8;
  NameSet *local_4d0;
  undefined1 local_4c8 [56];
  uint auStack_490 [2];
  int local_488;
  bool local_484;
  fpclass_type local_480;
  int32_t iStack_47c;
  DataKey local_478;
  uint auStack_470 [2];
  uint local_468 [2];
  uint auStack_460 [2];
  uint local_458 [2];
  uint auStack_450 [2];
  _func_int *local_448;
  uint auStack_440 [2];
  int local_438;
  bool local_434;
  fpclass_type local_430;
  int32_t iStack_42c;
  _func_int **local_428;
  int iStack_420;
  int iStack_41c;
  int *local_418;
  undefined8 uStack_410;
  uint local_408 [2];
  uint auStack_400 [2];
  _func_int *local_3f8;
  uint auStack_3f0 [2];
  int local_3e8;
  bool local_3e4;
  fpclass_type local_3e0;
  int32_t iStack_3dc;
  _func_int **local_3d8 [3];
  Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *local_3c0;
  SPxOut *local_3b0;
  double local_3a8;
  undefined8 uStack_3a0;
  undefined1 local_390 [296];
  undefined1 local_268 [16];
  undefined1 local_258 [16];
  undefined1 local_248 [16];
  char local_238;
  char local_138 [256];
  undefined2 local_38;
  int local_34;
  
  local_610 = p_intvars;
  local_4d8 = p_cnames;
  if (p_cnames == (NameSet *)0x0) {
    local_648 = (NameSet *)0x0;
    spx_alloc<soplex::NameSet*>(&local_648,1);
    p_cnames = local_648;
    NameSet::NameSet(local_648,10000,-1,2.0,2.0);
  }
  local_648 = p_cnames;
  NameSet::clear(p_cnames);
  local_4d0 = p_rnames;
  if (p_rnames == (NameSet *)0x0) {
    local_640 = (NameSet *)0x0;
    spx_alloc<soplex::NameSet*>(&local_640,1);
    p_rnames = local_640;
    NameSet::NameSet(local_640,10000,-1,2.0,2.0);
  }
  this_00 = &this->
             super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ;
  local_640 = p_rnames;
  NameSet::clear(p_rnames);
  clear(this);
  SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::memRemax(&this_00->
              super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             ,100000);
  local_4e0 = this_00;
  LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::reMax(this_00,10000);
  local_390._0_8_ = &PTR__MPSInput_006a9fa8;
  local_390._8_4_ = NAME;
  local_390._24_4_ = 0;
  local_390._28_4_ = MINIMIZE;
  local_390[0x20] = false;
  local_390[0x21] = '\0';
  local_38._0_1_ = false;
  local_38._1_1_ = false;
  local_34 = 0;
  local_138[0] = '\0';
  local_268 = (undefined1  [16])0x0;
  local_258 = (undefined1  [16])0x0;
  local_248 = (undefined1  [16])0x0;
  local_238 = '\0';
  local_390._16_8_ = p_input;
  MPSreadName((MPSInput *)local_390,this->spxout);
  if (local_390._8_4_ == OBJSEN) {
    MPSreadObjsen((MPSInput *)local_390);
  }
  if (local_390._8_4_ == OBJNAME) {
    bVar19 = MPSInput::readLine((MPSInput *)local_390);
    if ((bVar19) && ((char *)local_268._8_8_ != (char *)0x0)) {
      spxSnprintf(local_138,0x100,"%s");
      bVar19 = MPSInput::readLine((MPSInput *)local_390);
      if ((bVar19) &&
         (((char *)local_268._0_8_ != (char *)0x0 &&
          (iVar20 = strcmp((char *)local_268._0_8_,"ROWS"), iVar20 == 0)))) {
        local_390._8_4_ = ROWS;
        goto LAB_0037d513;
      }
    }
    MPSInput::syntaxError((MPSInput *)local_390);
  }
LAB_0037d513:
  pNVar18 = local_640;
  if (local_390._8_4_ == ROWS) {
    local_650 = this->spxout;
    LPRowBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ::LPRowBase((LPRowBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 *)local_4c8,0);
    local_628 = *(NameSet **)(in_FS_OFFSET + -8);
    uStack_620 = 0;
    local_638 = (NameSet *)((ulong)local_628 ^ 0x8000000000000000);
    uStack_630 = 0x8000000000000000;
    while (bVar19 = MPSInput::readLine((MPSInput *)local_390), pSVar28 = local_650, bVar19) {
      if ((char *)local_268._0_8_ != (char *)0x0) {
        if ((local_650 != (SPxOut *)0x0) && (3 < (int)local_650->m_verbosity)) {
          local_608._0_4_ = local_650->m_verbosity;
          local_6f8._0_4_ = 4;
          (*local_650->_vptr_SPxOut[2])(local_650);
          std::__ostream_insert<char,std::char_traits<char>>
                    (pSVar28->m_streams[pSVar28->m_verbosity],"IMPSRD02 Objective name : ",0x1a);
          poVar6 = pSVar28->m_streams[pSVar28->m_verbosity];
          sVar25 = strlen(local_138);
          std::__ostream_insert<char,std::char_traits<char>>(poVar6,local_138,sVar25);
          cVar5 = (char)pSVar28->m_streams[pSVar28->m_verbosity];
          std::ios::widen((char)*(undefined8 *)
                                 (*(long *)pSVar28->m_streams[pSVar28->m_verbosity] + -0x18) + cVar5
                         );
          std::ostream::put(cVar5);
          std::ostream::flush();
          (*pSVar28->_vptr_SPxOut[2])(pSVar28,local_608);
        }
        iVar20 = strcmp((char *)local_268._0_8_,"COLUMNS");
        if (iVar20 == 0) {
          local_390._8_4_ = COLUMNS;
          goto LAB_0037da00;
        }
        break;
      }
      if (((char *)local_268._8_8_ == (char *)0x0) || ((char *)local_258._0_8_ == (char *)0x0))
      break;
      if (*(char *)local_268._8_8_ == 'N') {
        if (local_138[0] == '\0') {
          spxSnprintf(local_138,0x100,"%s");
        }
      }
      else {
        local_608._0_8_ = local_258._0_8_;
        pcVar23 = DataHashTable<soplex::NameSet::Name,_soplex::DataKey>::index
                            (&pNVar18->hashtab,(char *)local_608,__c);
        if (-1 < (int)pcVar23) break;
        NameSet::add(pNVar18,(char *)local_258._0_8_);
        cVar5 = *(char *)local_268._8_8_;
        if (cVar5 == 'E') {
          pcVar24 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::zero();
          local_488 = pcVar24->exp;
          local_484 = pcVar24->neg;
          local_4c8._0_4_ = (pcVar24->data)._M_elems[0];
          local_4c8._4_4_ = (pcVar24->data)._M_elems[1];
          local_4c8._8_8_ = *(undefined8 *)((pcVar24->data)._M_elems + 2);
          local_4c8._16_8_ = *(undefined8 *)((pcVar24->data)._M_elems + 4);
          local_4c8._24_8_ = *(undefined8 *)((pcVar24->data)._M_elems + 6);
          local_4c8._32_8_ = *(undefined8 *)((pcVar24->data)._M_elems + 8);
          local_4c8._40_8_ = *(undefined8 *)((pcVar24->data)._M_elems + 10);
          local_4c8._48_8_ = *(undefined8 *)((pcVar24->data)._M_elems + 0xc);
          auStack_490 = *(uint (*) [2])((pcVar24->data)._M_elems + 0xe);
          local_480 = pcVar24->fpclass;
          iStack_47c = pcVar24->prec_elem;
          pcVar24 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::zero();
LAB_0037d8aa:
          local_438 = pcVar24->exp;
          local_434 = pcVar24->neg;
          local_430 = pcVar24->fpclass;
          iStack_42c = pcVar24->prec_elem;
          local_478.info = (pcVar24->data)._M_elems[0];
          local_478.idx = (pcVar24->data)._M_elems[1];
          auStack_470 = *(uint (*) [2])((pcVar24->data)._M_elems + 2);
          local_468 = *(uint (*) [2])((pcVar24->data)._M_elems + 4);
          auStack_460 = *(uint (*) [2])((pcVar24->data)._M_elems + 6);
          local_458 = *(uint (*) [2])((pcVar24->data)._M_elems + 8);
          auStack_450 = *(uint (*) [2])((pcVar24->data)._M_elems + 10);
          local_448 = *(_func_int **)((pcVar24->data)._M_elems + 0xc);
          auStack_440 = *(uint (*) [2])((pcVar24->data)._M_elems + 0xe);
        }
        else {
          if (cVar5 == 'L') {
            ::soplex::infinity::__tls_init();
            local_5c0._0_4_ = cpp_dec_float_finite;
            local_5c0._4_4_ = 0x10;
            local_608 = (undefined1  [16])0x0;
            local_5f8 = (undefined1  [16])0x0;
            local_5e8 = (undefined1  [16])0x0;
            local_5d8 = (_func_int *)0x0;
            _uStack_5d0 = 0;
            uStack_5cb = 0;
            iStack_5c8 = 0;
            bStack_5c4 = false;
            boost::multiprecision::backends::cpp_dec_float<100u,int,void>::operator=
                      ((cpp_dec_float<100u,int,void> *)local_608,(double)local_638);
            auStack_490[1]._1_3_ = uStack_5cb;
            auStack_490._0_5_ = _uStack_5d0;
            local_4c8._48_8_ = local_5d8;
            local_4c8._32_8_ = local_5e8._0_8_;
            local_4c8._40_8_ = local_5e8._8_8_;
            local_4c8._16_8_ = local_5f8._0_8_;
            local_4c8._24_8_ = local_5f8._8_8_;
            local_4c8._0_8_ = local_608._0_8_;
            local_4c8._8_8_ = local_608._8_8_;
            local_488 = iStack_5c8;
            local_484 = bStack_5c4;
            local_480 = (fpclass_type)local_5c0;
            iStack_47c = local_5c0._4_4_;
            pcVar24 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::zero();
            goto LAB_0037d8aa;
          }
          if (cVar5 != 'G') break;
          pcVar24 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::zero();
          local_488 = pcVar24->exp;
          local_484 = pcVar24->neg;
          local_4c8._0_4_ = (pcVar24->data)._M_elems[0];
          local_4c8._4_4_ = (pcVar24->data)._M_elems[1];
          local_4c8._8_8_ = *(undefined8 *)((pcVar24->data)._M_elems + 2);
          local_4c8._16_8_ = *(undefined8 *)((pcVar24->data)._M_elems + 4);
          local_4c8._24_8_ = *(undefined8 *)((pcVar24->data)._M_elems + 6);
          local_4c8._32_8_ = *(undefined8 *)((pcVar24->data)._M_elems + 8);
          local_4c8._40_8_ = *(undefined8 *)((pcVar24->data)._M_elems + 10);
          local_4c8._48_8_ = *(undefined8 *)((pcVar24->data)._M_elems + 0xc);
          auStack_490 = *(uint (*) [2])((pcVar24->data)._M_elems + 0xe);
          local_480 = pcVar24->fpclass;
          iStack_47c = pcVar24->prec_elem;
          ::soplex::infinity::__tls_init();
          local_5c0._0_4_ = cpp_dec_float_finite;
          local_5c0._4_4_ = 0x10;
          local_608 = (undefined1  [16])0x0;
          local_5f8 = (undefined1  [16])0x0;
          local_5e8 = (undefined1  [16])0x0;
          local_5d8 = (_func_int *)0x0;
          _uStack_5d0 = 0;
          uStack_5cb = 0;
          iStack_5c8 = 0;
          bStack_5c4 = false;
          boost::multiprecision::backends::cpp_dec_float<100u,int,void>::operator=
                    ((cpp_dec_float<100u,int,void> *)local_608,(double)local_628);
          auVar17 = local_5e8;
          auVar16 = local_5f8;
          auStack_440[1]._1_3_ = uStack_5cb;
          auStack_440._0_5_ = _uStack_5d0;
          local_448 = local_5d8;
          local_458[0] = local_5e8._0_4_;
          local_458[1] = local_5e8._4_4_;
          auStack_450[0] = local_5e8._8_4_;
          auStack_450[1] = local_5e8._12_4_;
          local_468[0] = local_5f8._0_4_;
          local_468[1] = local_5f8._4_4_;
          auStack_460[0] = local_5f8._8_4_;
          auStack_460[1] = local_5f8._12_4_;
          local_478.info = local_608._0_4_;
          local_478.idx = local_608._4_4_;
          auStack_470[0] = local_608._8_4_;
          auStack_470[1] = local_608._12_4_;
          local_438 = iStack_5c8;
          local_434 = bStack_5c4;
          local_430 = (fpclass_type)local_5c0;
          iStack_42c = local_5c0._4_4_;
          local_5f8 = auVar16;
          local_5e8 = auVar17;
        }
        local_608._0_8_ = 0xffffffff00000000;
        LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ::add(&this->
               super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ,(DataKey *)local_608,
              (LPRowBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               *)local_4c8);
      }
    }
    MPSInput::syntaxError((MPSInput *)local_390);
LAB_0037da00:
    local_3d8[0] = (_func_int **)&PTR__DSVectorBase_006b0b50;
    if (local_3c0 !=
        (Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
         *)0x0) {
      free(local_3c0);
      local_3c0 = (Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   *)0x0;
    }
  }
  (*(this->
    super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ).
    super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    .
    super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
    ._vptr_ClassArray[0x50])();
  if (local_390._8_4_ == COLUMNS) {
    local_628 = local_640;
    local_638 = local_648;
    local_660._0_4_ = cpp_dec_float_finite;
    local_660._4_4_ = 0x10;
    local_6a8 = (undefined1  [16])0x0;
    local_698 = (undefined1  [16])0x0;
    local_688 = (undefined1  [16])0x0;
    local_678 = (_func_int *)0x0;
    _uStack_670 = 0;
    uStack_66b = 0;
    iStack_668 = 0;
    bStack_664 = false;
    memset(local_608,0,0x100);
    LPColBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ::LPColBase((LPColBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 *)local_4c8,
                (this->
                super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ).
                super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                .set.thenum);
    local_4f8.m_elem =
         (Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          *)0x0;
    local_4f8.memsize = 0;
    local_4f8.memused = 0;
    local_500 = (undefined1  [8])&PTR__DSVectorBase_006b0b50;
    local_4e8 = (Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 *)0x0;
    DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ::allocMem((DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                *)local_500,8);
    pcVar24 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::zero();
    local_3e8 = pcVar24->exp;
    local_3e4 = pcVar24->neg;
    local_3e0 = pcVar24->fpclass;
    iStack_3dc = pcVar24->prec_elem;
    local_428 = *(_func_int ***)(pcVar24->data)._M_elems;
    iStack_420 = (pcVar24->data)._M_elems[2];
    iStack_41c = (pcVar24->data)._M_elems[3];
    local_418 = *(int **)((pcVar24->data)._M_elems + 4);
    uStack_410 = *(undefined8 *)((pcVar24->data)._M_elems + 6);
    local_408 = *(uint (*) [2])((pcVar24->data)._M_elems + 8);
    auStack_400 = *(uint (*) [2])((pcVar24->data)._M_elems + 10);
    local_3f8 = *(_func_int **)((pcVar24->data)._M_elems + 0xc);
    auStack_3f0 = *(uint (*) [2])((pcVar24->data)._M_elems + 0xe);
    local_4f8.memused = 0;
    local_650 = *(SPxOut **)(in_FS_OFFSET + -8);
LAB_0037db83:
    bVar19 = MPSInput::readLine((MPSInput *)local_390);
    if (bVar19) {
      if ((char *)local_268._0_8_ != (char *)0x0) {
        iVar20 = strcmp((char *)local_268._0_8_,"RHS");
        if (iVar20 == 0) {
          if (local_608[0] != (cpp_dec_float<100u,int,void>)0x0) {
            DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>>
            ::operator=((DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>>
                         *)local_3d8,&local_4f8);
            local_6f8._0_8_ = 0xffffffff00000000;
            LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            ::add(local_4e0,(DataKey *)local_6f8,
                  (LPColBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   *)local_4c8);
          }
          local_390._8_4_ = RHS;
          goto LAB_0037e1f5;
        }
        goto LAB_0037e1e1;
      }
      if ((((char *)local_268._8_8_ == (char *)0x0) || ((char *)local_258._0_8_ == (char *)0x0)) ||
         ((char *)local_258._8_8_ == (char *)0x0)) goto LAB_0037e1e1;
      iVar20 = strcmp(local_608,(char *)local_268._8_8_);
      if (iVar20 != 0) {
        if (local_608[0] != (cpp_dec_float<100u,int,void>)0x0) {
          DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>>
          ::operator=((DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>>
                       *)local_3d8,&local_4f8);
          local_6f8._0_8_ = 0xffffffff00000000;
          LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ::add(local_4e0,(DataKey *)local_6f8,
                (LPColBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 *)local_4c8);
        }
        spxSnprintf(local_608,0xff,"%s",local_268._8_8_);
        local_509 = 0;
        iVar20 = (local_638->set).thesize;
        NameSet::add(local_638,local_608);
        iVar21 = (local_638->set).thesize;
        if (iVar20 < iVar21) {
          local_4f8.memused = 0;
          pcVar24 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::zero();
          local_3e8 = pcVar24->exp;
          local_3e4 = pcVar24->neg;
          local_3e0 = pcVar24->fpclass;
          iStack_3dc = pcVar24->prec_elem;
          local_428 = *(_func_int ***)(pcVar24->data)._M_elems;
          iStack_420 = (pcVar24->data)._M_elems[2];
          iStack_41c = (pcVar24->data)._M_elems[3];
          local_418 = *(int **)((pcVar24->data)._M_elems + 4);
          uStack_410 = *(undefined8 *)((pcVar24->data)._M_elems + 6);
          local_408 = *(uint (*) [2])((pcVar24->data)._M_elems + 8);
          auStack_400 = *(uint (*) [2])((pcVar24->data)._M_elems + 10);
          local_3f8 = *(_func_int **)((pcVar24->data)._M_elems + 0xc);
          auStack_3f0 = *(uint (*) [2])((pcVar24->data)._M_elems + 0xe);
          pcVar24 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::zero();
          local_438 = pcVar24->exp;
          local_434 = pcVar24->neg;
          local_430 = pcVar24->fpclass;
          iStack_42c = pcVar24->prec_elem;
          local_478.info = (pcVar24->data)._M_elems[0];
          local_478.idx = (pcVar24->data)._M_elems[1];
          auStack_470 = *(uint (*) [2])((pcVar24->data)._M_elems + 2);
          local_468 = *(uint (*) [2])((pcVar24->data)._M_elems + 4);
          auStack_460 = *(uint (*) [2])((pcVar24->data)._M_elems + 6);
          local_458 = *(uint (*) [2])((pcVar24->data)._M_elems + 8);
          auStack_450 = *(uint (*) [2])((pcVar24->data)._M_elems + 10);
          local_448 = *(_func_int **)((pcVar24->data)._M_elems + 0xc);
          auStack_440 = *(uint (*) [2])((pcVar24->data)._M_elems + 0xe);
          ::soplex::infinity::__tls_init();
          local_6b0._0_4_ = cpp_dec_float_finite;
          local_6b0._4_4_ = 0x10;
          local_6f8 = ZEXT816(0);
          local_6e8 = ZEXT816(0);
          local_6d8 = ZEXT816(0);
          local_6c8 = (_func_int *)0x0;
          _uStack_6c0 = 0;
          uStack_6bb = 0;
          iStack_6b8 = 0;
          bStack_6b4 = false;
          boost::multiprecision::backends::cpp_dec_float<100u,int,void>::operator=
                    ((cpp_dec_float<100u,int,void> *)local_6f8,(double)local_650);
          auStack_490[1]._1_3_ = uStack_6bb;
          auStack_490._0_5_ = _uStack_6c0;
          local_4c8._48_8_ = local_6c8;
          local_4c8._32_8_ = local_6d8._0_8_;
          local_4c8._40_8_ = local_6d8._8_8_;
          local_4c8._16_8_ = local_6e8._0_8_;
          local_4c8._24_8_ = local_6e8._8_8_;
          local_4c8._0_8_ = local_6f8._0_8_;
          local_4c8._8_8_ = local_6f8._8_8_;
          local_488 = iStack_6b8;
          local_484 = bStack_6b4;
          local_480 = (fpclass_type)local_6b0;
          iStack_47c = local_6b0._4_4_;
          if (local_38._0_1_ == true) {
            if (local_610 != (DIdxSet *)0x0) {
              i = NameSet::number(local_638,local_608);
              DIdxSet::addIdx(local_610,i);
            }
            pcVar24 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::one();
            local_488 = pcVar24->exp;
            local_484 = pcVar24->neg;
            local_4c8._0_4_ = (pcVar24->data)._M_elems[0];
            local_4c8._4_4_ = (pcVar24->data)._M_elems[1];
            local_4c8._8_8_ = *(undefined8 *)((pcVar24->data)._M_elems + 2);
            local_4c8._16_8_ = *(undefined8 *)((pcVar24->data)._M_elems + 4);
            local_4c8._24_8_ = *(undefined8 *)((pcVar24->data)._M_elems + 6);
            local_4c8._32_8_ = *(undefined8 *)((pcVar24->data)._M_elems + 8);
            local_4c8._40_8_ = *(undefined8 *)((pcVar24->data)._M_elems + 10);
            local_4c8._48_8_ = *(undefined8 *)((pcVar24->data)._M_elems + 0xc);
            auStack_490 = *(uint (*) [2])((pcVar24->data)._M_elems + 0xe);
            local_480 = pcVar24->fpclass;
            iStack_47c = pcVar24->prec_elem;
          }
        }
        else {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cerr,
                     "ERROR in COLUMNS: duplicate column name or not column-wise ordering",0x43);
          std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + -0x80);
          std::ostream::put(-0x80);
          std::ostream::flush();
        }
        if (iVar21 <= iVar20) goto LAB_0037e1e1;
      }
      dVar29 = atof((char *)local_258._8_8_);
      boost::multiprecision::backends::cpp_dec_float<100u,int,void>::operator=
                ((cpp_dec_float<100u,int,void> *)local_6a8,dVar29);
      uVar8 = local_258._0_8_;
      iVar20 = strcmp((char *)local_258._0_8_,local_138);
      auVar17 = local_688;
      auVar16 = local_6a8;
      if (iVar20 == 0) {
        auStack_3f0[1]._1_3_ = uStack_66b;
        auStack_3f0._0_5_ = _uStack_670;
        local_3f8 = local_678;
        local_408[0] = local_688._0_4_;
        local_408[1] = local_688._4_4_;
        auStack_400[0] = local_688._8_4_;
        auStack_400[1] = local_688._12_4_;
        local_418 = (int *)local_698._0_8_;
        uStack_410 = local_698._8_8_;
        local_428 = (_func_int **)local_6a8._0_8_;
        iStack_420 = local_6a8._8_4_;
        iStack_41c = local_6a8._12_4_;
        local_3e8 = iStack_668;
        local_3e4 = bStack_664;
        local_3e0 = (fpclass_type)local_660;
        iStack_3dc = local_660._4_4_;
        local_6a8 = auVar16;
        local_688 = auVar17;
      }
      else {
        iVar20 = NameSet::number(local_628,(char *)uVar8);
        if (iVar20 < 0) {
          MPSInput::entryIgnored
                    ((MPSInput *)local_390,"Column",(char *)local_268._8_8_,"row",
                     (char *)local_258._0_8_);
        }
        else {
          if ((fpclass_type)local_660 != cpp_dec_float_NaN) {
            local_6b0._0_4_ = cpp_dec_float_finite;
            local_6b0._4_4_ = 0x10;
            local_6f8 = (undefined1  [16])0x0;
            local_6e8 = (undefined1  [16])0x0;
            local_6d8 = (undefined1  [16])0x0;
            local_6c8 = (_func_int *)0x0;
            _uStack_6c0 = 0;
            uStack_6bb = 0;
            iStack_6b8 = 0;
            bStack_6b4 = false;
            pcVar24 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::zero();
            local_6f8 = *(undefined1 (*) [16])(pcVar24->data)._M_elems;
            local_6e8 = *(undefined1 (*) [16])((pcVar24->data)._M_elems + 4);
            local_6d8 = *(undefined1 (*) [16])((pcVar24->data)._M_elems + 8);
            local_6c8 = *(_func_int **)((pcVar24->data)._M_elems + 0xc);
            uVar8 = *(undefined8 *)((pcVar24->data)._M_elems + 0xe);
            _uStack_6c0 = (undefined5)uVar8;
            uStack_6bb = (undefined3)((ulong)uVar8 >> 0x28);
            iStack_6b8 = pcVar24->exp;
            bStack_6b4 = pcVar24->neg;
            local_6b0._0_4_ = pcVar24->fpclass;
            local_6b0._4_4_ = pcVar24->prec_elem;
            iVar21 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::compare
                               ((cpp_dec_float<100U,_int,_void> *)local_6a8,
                                (cpp_dec_float<100U,_int,_void> *)local_6f8);
            if (iVar21 == 0) goto LAB_0037e034;
          }
          DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ::add((DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 *)local_500,iVar20,
                (number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *)local_6a8);
        }
      }
LAB_0037e034:
      if ((char *)local_248._8_8_ != (char *)0x0) {
        dVar29 = atof((char *)local_248._8_8_);
        boost::multiprecision::backends::cpp_dec_float<100u,int,void>::operator=
                  ((cpp_dec_float<100u,int,void> *)local_6a8,dVar29);
        uVar8 = local_248._0_8_;
        iVar20 = strcmp((char *)local_248._0_8_,local_138);
        auVar17 = local_688;
        auVar16 = local_6a8;
        if (iVar20 == 0) {
          auStack_3f0[1]._1_3_ = uStack_66b;
          auStack_3f0._0_5_ = _uStack_670;
          local_3f8 = local_678;
          local_408[0] = local_688._0_4_;
          local_408[1] = local_688._4_4_;
          auStack_400[0] = local_688._8_4_;
          auStack_400[1] = local_688._12_4_;
          local_418 = (int *)local_698._0_8_;
          uStack_410 = local_698._8_8_;
          local_428 = (_func_int **)local_6a8._0_8_;
          iStack_420 = local_6a8._8_4_;
          iStack_41c = local_6a8._12_4_;
          local_3e8 = iStack_668;
          local_3e4 = bStack_664;
          local_3e0 = (fpclass_type)local_660;
          iStack_3dc = local_660._4_4_;
          local_6a8 = auVar16;
          local_688 = auVar17;
          goto LAB_0037db83;
        }
        iVar20 = NameSet::number(local_628,(char *)uVar8);
        if (-1 < iVar20) {
          if ((fpclass_type)local_660 != cpp_dec_float_NaN) {
            local_6b0._0_4_ = cpp_dec_float_finite;
            local_6b0._4_4_ = 0x10;
            local_6f8 = (undefined1  [16])0x0;
            local_6e8 = (undefined1  [16])0x0;
            local_6d8 = (undefined1  [16])0x0;
            local_6c8 = (_func_int *)0x0;
            _uStack_6c0 = 0;
            uStack_6bb = 0;
            iStack_6b8 = 0;
            bStack_6b4 = false;
            pcVar24 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::zero();
            local_6f8 = *(undefined1 (*) [16])(pcVar24->data)._M_elems;
            local_6e8 = *(undefined1 (*) [16])((pcVar24->data)._M_elems + 4);
            local_6d8 = *(undefined1 (*) [16])((pcVar24->data)._M_elems + 8);
            local_6c8 = *(_func_int **)((pcVar24->data)._M_elems + 0xc);
            uVar8 = *(undefined8 *)((pcVar24->data)._M_elems + 0xe);
            _uStack_6c0 = (undefined5)uVar8;
            uStack_6bb = (undefined3)((ulong)uVar8 >> 0x28);
            iStack_6b8 = pcVar24->exp;
            bStack_6b4 = pcVar24->neg;
            local_6b0._0_4_ = pcVar24->fpclass;
            local_6b0._4_4_ = pcVar24->prec_elem;
            iVar21 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::compare
                               ((cpp_dec_float<100U,_int,_void> *)local_6a8,
                                (cpp_dec_float<100U,_int,_void> *)local_6f8);
            if (iVar21 == 0) goto LAB_0037db83;
          }
          DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ::add((DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 *)local_500,iVar20,
                (number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *)local_6a8);
          goto LAB_0037db83;
        }
        MPSInput::entryIgnored
                  ((MPSInput *)local_390,"Column",(char *)local_268._8_8_,"row",
                   (char *)local_248._0_8_);
      }
      goto LAB_0037db83;
    }
LAB_0037e1e1:
    MPSInput::syntaxError((MPSInput *)local_390);
LAB_0037e1f5:
    local_500 = (undefined1  [8])&PTR__DSVectorBase_006b0b50;
    if (local_4e8 !=
        (Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
         *)0x0) {
      free(local_4e8);
      local_4e8 = (Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   *)0x0;
    }
    local_3d8[0] = (_func_int **)&PTR__DSVectorBase_006b0b50;
    if (local_3c0 !=
        (Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
         *)0x0) {
      free(local_3c0);
      local_3c0 = (Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   *)0x0;
    }
  }
  pNVar18 = local_640;
  if (local_390._8_4_ == RHS) {
    pSVar28 = this->spxout;
    memset((DataKey *)local_4c8,0,0x100);
    memset(local_608,0,0x100);
    local_6b0._0_4_ = cpp_dec_float_finite;
    local_6b0._4_4_ = 0x10;
    local_6f8 = (undefined1  [16])0x0;
    local_6e8 = (undefined1  [16])0x0;
    local_6d8 = (undefined1  [16])0x0;
    local_6c8 = (_func_int *)0x0;
    _uStack_6c0 = 0;
    uStack_6bb = 0;
    iStack_6b8 = 0;
    bStack_6b4 = false;
    bVar19 = MPSInput::readLine((MPSInput *)local_390);
    if (bVar19) {
      local_638 = *(NameSet **)(in_FS_OFFSET + -8);
      uStack_630 = 0;
      local_628 = (NameSet *)((ulong)local_638 ^ 0x8000000000000000);
      uStack_620 = 0x8000000000000000;
      while ((char *)local_268._0_8_ == (char *)0x0) {
        if ((((char *)local_258._0_8_ != (char *)0x0) && ((char *)local_258._8_8_ == (char *)0x0))
           || (((char *)local_248._0_8_ != (char *)0x0 && ((char *)local_248._8_8_ == (char *)0x0)))
           ) {
          MPSInput::insertName((MPSInput *)local_390,"_RHS_",false);
        }
        if ((((char *)local_268._8_8_ == (char *)0x0) || ((char *)local_258._0_8_ == (char *)0x0))
           || ((char *)local_258._8_8_ == (char *)0x0)) goto LAB_0037ea55;
        if (local_4c8[0] == '\0') {
          spxSnprintf((char *)local_4c8,0x100,"%s");
        }
        uVar8 = local_268._8_8_;
        iVar20 = strcmp((char *)local_4c8,(char *)local_268._8_8_);
        if (iVar20 == 0) {
          uVar22 = NameSet::number(pNVar18,(char *)local_258._0_8_);
          if ((int)uVar22 < 0) {
            MPSInput::entryIgnored
                      ((MPSInput *)local_390,"RHS",(char *)local_268._8_8_,"row",
                       (char *)local_258._0_8_);
          }
          else {
            dVar29 = atof((char *)local_258._8_8_);
            boost::multiprecision::backends::cpp_dec_float<100u,int,void>::operator=
                      ((cpp_dec_float<100u,int,void> *)local_6f8,dVar29);
            pcVar24 = &(this->
                       super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       ).right.val.
                       super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                       ._M_impl.super__Vector_impl_data._M_start[uVar22].m_backend;
            ::soplex::infinity::__tls_init();
            local_660._0_4_ = cpp_dec_float_finite;
            local_660._4_4_ = 0x10;
            local_6a8 = (undefined1  [16])0x0;
            local_698 = (undefined1  [16])0x0;
            local_688 = (undefined1  [16])0x0;
            local_678 = (_func_int *)0x0;
            _uStack_670 = 0;
            uStack_66b = 0;
            iStack_668 = 0;
            bStack_664 = false;
            boost::multiprecision::backends::cpp_dec_float<100u,int,void>::operator=
                      ((cpp_dec_float<100u,int,void> *)local_6a8,(double)local_638);
            if (((pcVar24->fpclass != cpp_dec_float_NaN) &&
                ((fpclass_type)local_660 != cpp_dec_float_NaN)) &&
               (iVar20 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::compare
                                   (pcVar24,(cpp_dec_float<100U,_int,_void> *)local_6a8),
               auVar16 = local_6f8, local_6f8 = auVar16, iVar20 < 0)) {
              pnVar27 = (this->
                        super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                        ).right.val.
                        super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                        ._M_impl.super__Vector_impl_data._M_start;
              puVar3 = pnVar27[uVar22].m_backend.data._M_elems + 0xc;
              *(_func_int **)puVar3 = local_6c8;
              *(ulong *)(puVar3 + 2) = CONCAT35(uStack_6bb,_uStack_6c0);
              puVar3 = pnVar27[uVar22].m_backend.data._M_elems + 8;
              *(undefined8 *)puVar3 = local_6d8._0_8_;
              *(undefined8 *)(puVar3 + 2) = local_6d8._8_8_;
              puVar3 = pnVar27[uVar22].m_backend.data._M_elems + 4;
              *(undefined8 *)puVar3 = local_6e8._0_8_;
              *(undefined8 *)(puVar3 + 2) = local_6e8._8_8_;
              pDVar2 = (DataKey *)(pnVar27 + uVar22);
              pDVar2->info = local_6f8._0_4_;
              pDVar2->idx = local_6f8._4_4_;
              pDVar2[1].info = local_6f8._8_4_;
              pDVar2[1].idx = local_6f8._12_4_;
              pnVar27[uVar22].m_backend.exp = iStack_6b8;
              pnVar27[uVar22].m_backend.neg = bStack_6b4;
              pnVar27[uVar22].m_backend.fpclass = (fpclass_type)local_6b0;
              pnVar27[uVar22].m_backend.prec_elem = local_6b0._4_4_;
            }
            pcVar24 = &(this->
                       super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       ).left.val.
                       super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                       ._M_impl.super__Vector_impl_data._M_start[uVar22].m_backend;
            ::soplex::infinity::__tls_init();
            local_660._0_4_ = cpp_dec_float_finite;
            local_660._4_4_ = 0x10;
            local_6a8 = (undefined1  [16])0x0;
            local_698 = (undefined1  [16])0x0;
            local_688 = (undefined1  [16])0x0;
            local_678 = (_func_int *)0x0;
            _uStack_670 = 0;
            uStack_66b = 0;
            iStack_668 = 0;
            bStack_664 = false;
            boost::multiprecision::backends::cpp_dec_float<100u,int,void>::operator=
                      ((cpp_dec_float<100u,int,void> *)local_6a8,(double)local_628);
            if (((pcVar24->fpclass != cpp_dec_float_NaN) &&
                ((fpclass_type)local_660 != cpp_dec_float_NaN)) &&
               (iVar20 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::compare
                                   (pcVar24,(cpp_dec_float<100U,_int,_void> *)local_6a8),
               auVar16 = local_6f8, local_6f8 = auVar16, 0 < iVar20)) {
              pnVar27 = (this->
                        super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                        ).left.val.
                        super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                        ._M_impl.super__Vector_impl_data._M_start;
              puVar3 = pnVar27[uVar22].m_backend.data._M_elems + 0xc;
              *(_func_int **)puVar3 = local_6c8;
              *(ulong *)(puVar3 + 2) = CONCAT35(uStack_6bb,_uStack_6c0);
              puVar3 = pnVar27[uVar22].m_backend.data._M_elems + 8;
              *(undefined8 *)puVar3 = local_6d8._0_8_;
              *(undefined8 *)(puVar3 + 2) = local_6d8._8_8_;
              puVar3 = pnVar27[uVar22].m_backend.data._M_elems + 4;
              *(undefined8 *)puVar3 = local_6e8._0_8_;
              *(undefined8 *)(puVar3 + 2) = local_6e8._8_8_;
              pDVar2 = (DataKey *)(pnVar27 + uVar22);
              pDVar2->info = local_6f8._0_4_;
              pDVar2->idx = local_6f8._4_4_;
              pDVar2[1].info = local_6f8._8_4_;
              pDVar2[1].idx = local_6f8._12_4_;
              pnVar27[uVar22].m_backend.exp = iStack_6b8;
              pnVar27[uVar22].m_backend.neg = bStack_6b4;
              pnVar27[uVar22].m_backend.fpclass = (fpclass_type)local_6b0;
              pnVar27[uVar22].m_backend.prec_elem = local_6b0._4_4_;
            }
          }
          if ((char *)local_248._8_8_ != (char *)0x0) {
            uVar22 = NameSet::number(pNVar18,(char *)local_248._0_8_);
            if ((int)uVar22 < 0) {
              MPSInput::entryIgnored
                        ((MPSInput *)local_390,"RHS",(char *)local_268._8_8_,"row",
                         (char *)local_248._0_8_);
            }
            else {
              dVar29 = atof((char *)local_248._8_8_);
              boost::multiprecision::backends::cpp_dec_float<100u,int,void>::operator=
                        ((cpp_dec_float<100u,int,void> *)local_6f8,dVar29);
              pcVar24 = &(this->
                         super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                         ).right.val.
                         super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                         ._M_impl.super__Vector_impl_data._M_start[uVar22].m_backend;
              ::soplex::infinity::__tls_init();
              local_660._0_4_ = cpp_dec_float_finite;
              local_660._4_4_ = 0x10;
              local_6a8 = (undefined1  [16])0x0;
              local_698 = (undefined1  [16])0x0;
              local_688 = (undefined1  [16])0x0;
              local_678 = (_func_int *)0x0;
              _uStack_670 = 0;
              uStack_66b = 0;
              iStack_668 = 0;
              bStack_664 = false;
              boost::multiprecision::backends::cpp_dec_float<100u,int,void>::operator=
                        ((cpp_dec_float<100u,int,void> *)local_6a8,(double)local_638);
              if (((pcVar24->fpclass != cpp_dec_float_NaN) &&
                  ((fpclass_type)local_660 != cpp_dec_float_NaN)) &&
                 (iVar20 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::compare
                                     (pcVar24,(cpp_dec_float<100U,_int,_void> *)local_6a8),
                 auVar16 = local_6f8, local_6f8 = auVar16, iVar20 < 0)) {
                pnVar27 = (this->
                          super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                          ).right.val.
                          super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                          ._M_impl.super__Vector_impl_data._M_start;
                puVar3 = pnVar27[uVar22].m_backend.data._M_elems + 0xc;
                *(_func_int **)puVar3 = local_6c8;
                *(ulong *)(puVar3 + 2) = CONCAT35(uStack_6bb,_uStack_6c0);
                puVar3 = pnVar27[uVar22].m_backend.data._M_elems + 8;
                *(undefined8 *)puVar3 = local_6d8._0_8_;
                *(undefined8 *)(puVar3 + 2) = local_6d8._8_8_;
                puVar3 = pnVar27[uVar22].m_backend.data._M_elems + 4;
                *(undefined8 *)puVar3 = local_6e8._0_8_;
                *(undefined8 *)(puVar3 + 2) = local_6e8._8_8_;
                pDVar2 = (DataKey *)(pnVar27 + uVar22);
                pDVar2->info = local_6f8._0_4_;
                pDVar2->idx = local_6f8._4_4_;
                pDVar2[1].info = local_6f8._8_4_;
                pDVar2[1].idx = local_6f8._12_4_;
                pnVar27[uVar22].m_backend.exp = iStack_6b8;
                pnVar27[uVar22].m_backend.neg = bStack_6b4;
                pnVar27[uVar22].m_backend.fpclass = (fpclass_type)local_6b0;
                pnVar27[uVar22].m_backend.prec_elem = local_6b0._4_4_;
              }
              pcVar24 = &(this->
                         super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                         ).left.val.
                         super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                         ._M_impl.super__Vector_impl_data._M_start[uVar22].m_backend;
              ::soplex::infinity::__tls_init();
              local_660._0_4_ = cpp_dec_float_finite;
              local_660._4_4_ = 0x10;
              local_6a8 = (undefined1  [16])0x0;
              local_698 = (undefined1  [16])0x0;
              local_688 = (undefined1  [16])0x0;
              local_678 = (_func_int *)0x0;
              _uStack_670 = 0;
              uStack_66b = 0;
              iStack_668 = 0;
              bStack_664 = false;
              boost::multiprecision::backends::cpp_dec_float<100u,int,void>::operator=
                        ((cpp_dec_float<100u,int,void> *)local_6a8,(double)local_628);
              if (((pcVar24->fpclass != cpp_dec_float_NaN) &&
                  ((fpclass_type)local_660 != cpp_dec_float_NaN)) &&
                 (iVar20 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::compare
                                     (pcVar24,(cpp_dec_float<100U,_int,_void> *)local_6a8),
                 auVar16 = local_6f8, local_6f8 = auVar16, 0 < iVar20)) {
                pnVar27 = (this->
                          super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                          ).left.val.
                          super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                          ._M_impl.super__Vector_impl_data._M_start;
                puVar3 = pnVar27[uVar22].m_backend.data._M_elems + 0xc;
                *(_func_int **)puVar3 = local_6c8;
                *(ulong *)(puVar3 + 2) = CONCAT35(uStack_6bb,_uStack_6c0);
                puVar3 = pnVar27[uVar22].m_backend.data._M_elems + 8;
                *(undefined8 *)puVar3 = local_6d8._0_8_;
                *(undefined8 *)(puVar3 + 2) = local_6d8._8_8_;
                puVar3 = pnVar27[uVar22].m_backend.data._M_elems + 4;
                *(undefined8 *)puVar3 = local_6e8._0_8_;
                *(undefined8 *)(puVar3 + 2) = local_6e8._8_8_;
                pDVar2 = (DataKey *)(pnVar27 + uVar22);
                pDVar2->info = local_6f8._0_4_;
                pDVar2->idx = local_6f8._4_4_;
                pDVar2[1].info = local_6f8._8_4_;
                pDVar2[1].idx = local_6f8._12_4_;
                pnVar27[uVar22].m_backend.exp = iStack_6b8;
                pnVar27[uVar22].m_backend.neg = bStack_6b4;
                pnVar27[uVar22].m_backend.fpclass = (fpclass_type)local_6b0;
                pnVar27[uVar22].m_backend.prec_elem = local_6b0._4_4_;
              }
            }
          }
        }
        else {
          iVar20 = strcmp(local_608,(char *)uVar8);
          if (((iVar20 != 0) && (spxSnprintf(local_608,0x100,"%s",uVar8), pSVar28 != (SPxOut *)0x0))
             && (4 < (int)pSVar28->m_verbosity)) {
            local_6a8._0_4_ = pSVar28->m_verbosity;
            local_500._0_4_ = 5;
            (*pSVar28->_vptr_SPxOut[2])(pSVar28,local_500);
            std::__ostream_insert<char,std::char_traits<char>>
                      (pSVar28->m_streams[pSVar28->m_verbosity],"IMPSRD07 RHS ignored    : ",0x1a);
            poVar6 = pSVar28->m_streams[pSVar28->m_verbosity];
            sVar25 = strlen(local_608);
            std::__ostream_insert<char,std::char_traits<char>>(poVar6,local_608,sVar25);
            cVar5 = (char)pSVar28->m_streams[pSVar28->m_verbosity];
            std::ios::widen((char)*(undefined8 *)
                                   (*(long *)pSVar28->m_streams[pSVar28->m_verbosity] + -0x18) +
                            cVar5);
            std::ostream::put(cVar5);
            std::ostream::flush();
            (*pSVar28->_vptr_SPxOut[2])(pSVar28);
          }
        }
        bVar19 = MPSInput::readLine((MPSInput *)local_390);
        if (!bVar19) goto LAB_0037ea55;
      }
      if ((pSVar28 != (SPxOut *)0x0) && (3 < (int)pSVar28->m_verbosity)) {
        local_6a8._0_4_ = pSVar28->m_verbosity;
        local_500._0_4_ = 4;
        (*pSVar28->_vptr_SPxOut[2])(pSVar28);
        std::__ostream_insert<char,std::char_traits<char>>
                  (pSVar28->m_streams[pSVar28->m_verbosity],"IMPSRD03 RHS name       : ",0x1a);
        poVar6 = pSVar28->m_streams[pSVar28->m_verbosity];
        sVar25 = strlen((char *)local_4c8);
        std::__ostream_insert<char,std::char_traits<char>>(poVar6,(char *)local_4c8,sVar25);
        cVar5 = (char)pSVar28->m_streams[pSVar28->m_verbosity];
        std::ios::widen((char)*(undefined8 *)
                               (*(long *)pSVar28->m_streams[pSVar28->m_verbosity] + -0x18) + cVar5);
        std::ostream::put(cVar5);
        std::ostream::flush();
        (*pSVar28->_vptr_SPxOut[2])(pSVar28,local_6a8);
      }
      uVar8 = local_268._0_8_;
      iVar20 = strcmp((char *)local_268._0_8_,"RANGES");
      if (iVar20 == 0) {
        local_390._8_4_ = RANGES;
        goto LAB_0037ea62;
      }
      iVar20 = strcmp((char *)uVar8,"BOUNDS");
      if (iVar20 == 0) {
        local_390._8_4_ = BOUNDS;
        goto LAB_0037ea62;
      }
      iVar20 = strcmp((char *)uVar8,"ENDATA");
      if (iVar20 == 0) {
        local_390._8_4_ = ENDATA;
        goto LAB_0037ea62;
      }
    }
LAB_0037ea55:
    MPSInput::syntaxError((MPSInput *)local_390);
  }
LAB_0037ea62:
  if (local_390._8_4_ == RANGES) {
    local_628 = local_640;
    pSVar28 = this->spxout;
    memset((DataKey *)local_4c8,0,0x100);
    local_6b0._0_4_ = cpp_dec_float_finite;
    local_6b0._4_4_ = 0x10;
    local_6f8 = (undefined1  [16])0x0;
    local_6e8 = (undefined1  [16])0x0;
    local_6d8 = (undefined1  [16])0x0;
    local_6c8 = (_func_int *)0x0;
    _uStack_6c0 = 0;
    uStack_6bb = 0;
    iStack_6b8 = 0;
    bStack_6b4 = false;
    bVar19 = MPSInput::readLine((MPSInput *)local_390);
    local_3b0 = pSVar28;
    if (bVar19) {
      pVVar1 = &(this->
                super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ).left;
      local_3a8 = *(double *)(in_FS_OFFSET + -8);
      uStack_3a0 = 0;
      local_638 = (NameSet *)((ulong)local_3a8 ^ 0x8000000000000000);
      uStack_630 = 0x8000000000000000;
      local_650 = (SPxOut *)
                  &(this->
                   super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   ).right;
      while (pSVar28 = local_3b0, (char *)local_268._0_8_ == (char *)0x0) {
        if ((((char *)local_258._0_8_ != (char *)0x0) && ((char *)local_258._8_8_ == (char *)0x0))
           || (((char *)local_248._0_8_ != (char *)0x0 && ((char *)local_248._8_8_ == (char *)0x0)))
           ) {
          MPSInput::insertName((MPSInput *)local_390,"_RNG_",false);
        }
        if ((((char *)local_268._8_8_ == (char *)0x0) || ((char *)local_258._0_8_ == (char *)0x0))
           || ((char *)local_258._8_8_ == (char *)0x0)) goto LAB_0037f820;
        if (local_4c8[0] == '\0') {
          spxSnprintf((char *)local_4c8,0x100,"%s");
        }
        iVar20 = strcmp((char *)local_4c8,(char *)local_268._8_8_);
        if (iVar20 == 0) {
          uVar22 = NameSet::number(local_628,(char *)local_258._0_8_);
          if ((int)uVar22 < 0) {
            MPSInput::entryIgnored
                      ((MPSInput *)local_390,"Range",(char *)local_268._8_8_,"row",
                       (char *)local_258._0_8_);
          }
          else {
            dVar29 = atof((char *)local_258._8_8_);
            boost::multiprecision::backends::cpp_dec_float<100u,int,void>::operator=
                      ((cpp_dec_float<100u,int,void> *)local_6f8,dVar29);
            uVar26 = (ulong)uVar22;
            pcVar24 = &(pVVar1->val).
                       super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                       ._M_impl.super__Vector_impl_data._M_start[uVar26].m_backend;
            ::soplex::infinity::__tls_init();
            local_5c0._0_4_ = cpp_dec_float_finite;
            local_5c0._4_4_ = 0x10;
            local_608 = (undefined1  [16])0x0;
            local_5f8 = (undefined1  [16])0x0;
            local_5e8 = (undefined1  [16])0x0;
            local_5d8 = (_func_int *)0x0;
            _uStack_5d0 = 0;
            uStack_5cb = 0;
            iStack_5c8 = 0;
            bStack_5c4 = false;
            boost::multiprecision::backends::cpp_dec_float<100u,int,void>::operator=
                      ((cpp_dec_float<100u,int,void> *)local_608,(double)local_638);
            if (((pcVar24->fpclass != cpp_dec_float_NaN) &&
                ((fpclass_type)local_5c0 != cpp_dec_float_NaN)) &&
               (iVar20 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::compare
                                   (pcVar24,(cpp_dec_float<100U,_int,_void> *)local_608), 0 < iVar20
               )) {
              pp_Var7 = local_650->_vptr_SPxOut;
              ::soplex::infinity::__tls_init();
              local_660._0_4_ = cpp_dec_float_finite;
              local_660._4_4_ = 0x10;
              local_6a8 = (undefined1  [16])0x0;
              local_698 = (undefined1  [16])0x0;
              local_688 = (undefined1  [16])0x0;
              local_678 = (_func_int *)0x0;
              _uStack_670 = 0;
              uStack_66b = 0;
              iStack_668 = 0;
              bStack_664 = false;
              boost::multiprecision::backends::cpp_dec_float<100u,int,void>::operator=
                        ((cpp_dec_float<100u,int,void> *)local_6a8,local_3a8);
              if (((((cpp_dec_float<100U,_int,_void> *)(pp_Var7 + uVar26 * 10))->fpclass !=
                    cpp_dec_float_NaN) && ((fpclass_type)local_660 != cpp_dec_float_NaN)) &&
                 (iVar20 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::compare
                                     ((cpp_dec_float<100U,_int,_void> *)(pp_Var7 + uVar26 * 10),
                                      (cpp_dec_float<100U,_int,_void> *)local_6a8), iVar20 < 0)) {
                if ((fpclass_type)local_6b0 == cpp_dec_float_NaN) {
LAB_0037f68b:
                  pSVar28 = (SPxOut *)pVVar1;
                }
                else {
                  local_5c0._0_4_ = cpp_dec_float_finite;
                  local_5c0._4_4_ = 0x10;
                  local_608 = (undefined1  [16])0x0;
                  local_5f8 = (undefined1  [16])0x0;
                  local_5e8 = (undefined1  [16])0x0;
                  local_5d8 = (_func_int *)0x0;
                  _uStack_5d0 = 0;
                  uStack_5cb = 0;
                  iStack_5c8 = 0;
                  bStack_5c4 = false;
                  iVar20 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::compare
                                     ((cpp_dec_float<100U,_int,_void> *)local_6f8,
                                      (cpp_dec_float<100U,_int,_void> *)local_608);
                  pSVar28 = local_650;
                  if (iVar20 < 0) goto LAB_0037f68b;
                }
                boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator+=
                          ((cpp_dec_float<100U,_int,_void> *)(pSVar28->_vptr_SPxOut + uVar26 * 10),
                           (cpp_dec_float<100U,_int,_void> *)local_6f8);
                goto LAB_0037f10d;
              }
            }
            pcVar24 = &(pVVar1->val).
                       super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                       ._M_impl.super__Vector_impl_data._M_start[uVar26].m_backend;
            ::soplex::infinity::__tls_init();
            local_5c0._0_4_ = cpp_dec_float_finite;
            local_5c0._4_4_ = 0x10;
            local_608 = (undefined1  [16])0x0;
            local_5f8 = (undefined1  [16])0x0;
            local_5e8 = (undefined1  [16])0x0;
            local_5d8 = (_func_int *)0x0;
            _uStack_5d0 = 0;
            uStack_5cb = 0;
            iStack_5c8 = 0;
            bStack_5c4 = false;
            boost::multiprecision::backends::cpp_dec_float<100u,int,void>::operator=
                      ((cpp_dec_float<100u,int,void> *)local_608,(double)local_638);
            if (((pcVar24->fpclass == cpp_dec_float_NaN) ||
                ((fpclass_type)local_5c0 == cpp_dec_float_NaN)) ||
               (iVar20 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::compare
                                   (pcVar24,(cpp_dec_float<100U,_int,_void> *)local_608), iVar20 < 1
               )) {
              pcVar24 = (cpp_dec_float<100U,_int,_void> *)(local_650->_vptr_SPxOut + uVar26 * 10);
              local_678 = local_6c8;
              _uStack_670 = _uStack_6c0;
              uStack_66b = uStack_6bb;
              local_688 = local_6d8;
              local_698 = local_6e8;
              local_6a8 = local_6f8;
              auVar16 = local_6a8;
              iStack_668 = iStack_6b8;
              bStack_664 = bStack_6b4;
              local_660._0_4_ = (fpclass_type)local_6b0;
              local_660._4_4_ = local_6b0._4_4_;
              if ((bStack_6b4 == true) &&
                 (local_6a8._0_4_ = local_6f8._0_4_,
                 (fpclass_type)local_6b0 != cpp_dec_float_finite || local_6a8._0_4_ != 0)) {
                bStack_664 = false;
              }
              local_5c0._0_4_ = cpp_dec_float_finite;
              local_5c0._4_4_ = 0x10;
              local_608 = (undefined1  [16])0x0;
              local_5f8 = (undefined1  [16])0x0;
              local_5e8 = (undefined1  [16])0x0;
              local_5d8 = (_func_int *)0x0;
              _uStack_5d0 = 0;
              uStack_5cb = 0;
              iStack_5c8 = 0;
              bStack_5c4 = false;
              if ((cpp_dec_float<100U,_int,_void> *)local_608 != pcVar24) {
                local_608 = *(undefined1 (*) [16])(pcVar24->data)._M_elems;
                local_5f8 = *(undefined1 (*) [16])((pcVar24->data)._M_elems + 4);
                local_5e8 = *(undefined1 (*) [16])((pcVar24->data)._M_elems + 8);
                local_5d8 = *(_func_int **)((pcVar24->data)._M_elems + 0xc);
                uVar8 = *(undefined8 *)((pcVar24->data)._M_elems + 0xe);
                _uStack_5d0 = (undefined5)uVar8;
                uStack_5cb = (undefined3)((ulong)uVar8 >> 0x28);
                iStack_5c8 = pcVar24->exp;
                bStack_5c4 = pcVar24->neg;
                local_5c0._0_4_ = pcVar24->fpclass;
                local_5c0._4_4_ = pcVar24->prec_elem;
              }
              local_6a8 = auVar16;
              boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator-=
                        ((cpp_dec_float<100U,_int,_void> *)local_608,
                         (cpp_dec_float<100U,_int,_void> *)local_6a8);
              pnVar27 = (pVVar1->val).
                        super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                        ._M_impl.super__Vector_impl_data._M_start;
            }
            else {
              pcVar24 = &(pVVar1->val).
                         super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                         ._M_impl.super__Vector_impl_data._M_start[uVar26].m_backend;
              local_678 = local_6c8;
              _uStack_670 = _uStack_6c0;
              uStack_66b = uStack_6bb;
              local_688 = local_6d8;
              local_698 = local_6e8;
              local_6a8 = local_6f8;
              auVar16 = local_6a8;
              iStack_668 = iStack_6b8;
              bStack_664 = bStack_6b4;
              local_660._0_4_ = (fpclass_type)local_6b0;
              local_660._4_4_ = local_6b0._4_4_;
              if ((bStack_6b4 == true) &&
                 (local_6a8._0_4_ = local_6f8._0_4_,
                 (fpclass_type)local_6b0 != cpp_dec_float_finite || local_6a8._0_4_ != 0)) {
                bStack_664 = false;
              }
              local_5c0._0_4_ = cpp_dec_float_finite;
              local_5c0._4_4_ = 0x10;
              local_608 = (undefined1  [16])0x0;
              local_5f8 = (undefined1  [16])0x0;
              local_5e8 = (undefined1  [16])0x0;
              local_5d8 = (_func_int *)0x0;
              _uStack_5d0 = 0;
              uStack_5cb = 0;
              iStack_5c8 = 0;
              bStack_5c4 = false;
              if ((cpp_dec_float<100U,_int,_void> *)local_608 != pcVar24) {
                local_608 = *(undefined1 (*) [16])(pcVar24->data)._M_elems;
                local_5f8 = *(undefined1 (*) [16])((pcVar24->data)._M_elems + 4);
                local_5e8 = *(undefined1 (*) [16])((pcVar24->data)._M_elems + 8);
                local_5d8 = *(_func_int **)((pcVar24->data)._M_elems + 0xc);
                uVar8 = *(undefined8 *)((pcVar24->data)._M_elems + 0xe);
                _uStack_5d0 = (undefined5)uVar8;
                uStack_5cb = (undefined3)((ulong)uVar8 >> 0x28);
                iStack_5c8 = pcVar24->exp;
                bStack_5c4 = pcVar24->neg;
                local_5c0._0_4_ = pcVar24->fpclass;
                local_5c0._4_4_ = pcVar24->prec_elem;
              }
              local_6a8 = auVar16;
              boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator+=
                        ((cpp_dec_float<100U,_int,_void> *)local_608,
                         (cpp_dec_float<100U,_int,_void> *)local_6a8);
              pnVar27 = (pointer)local_650->_vptr_SPxOut;
            }
            auVar16 = local_608;
            puVar3 = pnVar27[uVar26].m_backend.data._M_elems + 0xc;
            *(_func_int **)puVar3 = local_5d8;
            *(_func_int **)(puVar3 + 2) = (_func_int *)CONCAT35(uStack_5cb,_uStack_5d0);
            puVar3 = pnVar27[uVar26].m_backend.data._M_elems + 8;
            *(undefined8 *)puVar3 = local_5e8._0_8_;
            *(undefined8 *)(puVar3 + 2) = local_5e8._8_8_;
            puVar3 = pnVar27[uVar26].m_backend.data._M_elems + 4;
            *(undefined8 *)puVar3 = local_5f8._0_8_;
            *(undefined8 *)(puVar3 + 2) = local_5f8._8_8_;
            pDVar2 = (DataKey *)(pnVar27 + uVar26);
            pDVar2->info = local_608._0_4_;
            pDVar2->idx = local_608._4_4_;
            pDVar2[1].info = local_608._8_4_;
            pDVar2[1].idx = local_608._12_4_;
            pnVar27[uVar26].m_backend.exp = iStack_5c8;
            pnVar27[uVar26].m_backend.neg = bStack_5c4;
            pnVar27[uVar26].m_backend.fpclass = (fpclass_type)local_5c0;
            pnVar27[uVar26].m_backend.prec_elem = local_5c0._4_4_;
            local_608 = auVar16;
          }
LAB_0037f10d:
          if ((char *)local_248._8_8_ != (char *)0x0) {
            uVar22 = NameSet::number(local_628,(char *)local_248._0_8_);
            if ((int)uVar22 < 0) {
              MPSInput::entryIgnored
                        ((MPSInput *)local_390,"Range",(char *)local_268._8_8_,"row",
                         (char *)local_248._0_8_);
            }
            else {
              dVar29 = atof((char *)local_248._8_8_);
              boost::multiprecision::backends::cpp_dec_float<100u,int,void>::operator=
                        ((cpp_dec_float<100u,int,void> *)local_6f8,dVar29);
              uVar26 = (ulong)uVar22;
              pcVar24 = &(pVVar1->val).
                         super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                         ._M_impl.super__Vector_impl_data._M_start[uVar26].m_backend;
              ::soplex::infinity::__tls_init();
              local_5c0._0_4_ = cpp_dec_float_finite;
              local_5c0._4_4_ = 0x10;
              local_608 = (undefined1  [16])0x0;
              local_5f8 = (undefined1  [16])0x0;
              local_5e8 = (undefined1  [16])0x0;
              local_5d8 = (_func_int *)0x0;
              _uStack_5d0 = 0;
              uStack_5cb = 0;
              iStack_5c8 = 0;
              bStack_5c4 = false;
              boost::multiprecision::backends::cpp_dec_float<100u,int,void>::operator=
                        ((cpp_dec_float<100u,int,void> *)local_608,(double)local_638);
              if (((pcVar24->fpclass != cpp_dec_float_NaN) &&
                  ((fpclass_type)local_5c0 != cpp_dec_float_NaN)) &&
                 (iVar20 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::compare
                                     (pcVar24,(cpp_dec_float<100U,_int,_void> *)local_608),
                 0 < iVar20)) {
                pp_Var7 = local_650->_vptr_SPxOut;
                ::soplex::infinity::__tls_init();
                local_660._0_4_ = cpp_dec_float_finite;
                local_660._4_4_ = 0x10;
                local_6a8 = (undefined1  [16])0x0;
                local_698 = (undefined1  [16])0x0;
                local_688 = (undefined1  [16])0x0;
                local_678 = (_func_int *)0x0;
                _uStack_670 = 0;
                uStack_66b = 0;
                iStack_668 = 0;
                bStack_664 = false;
                boost::multiprecision::backends::cpp_dec_float<100u,int,void>::operator=
                          ((cpp_dec_float<100u,int,void> *)local_6a8,local_3a8);
                if (((((cpp_dec_float<100U,_int,_void> *)(pp_Var7 + uVar26 * 10))->fpclass !=
                      cpp_dec_float_NaN) && ((fpclass_type)local_660 != cpp_dec_float_NaN)) &&
                   (iVar20 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::
                             compare((cpp_dec_float<100U,_int,_void> *)(pp_Var7 + uVar26 * 10),
                                     (cpp_dec_float<100U,_int,_void> *)local_6a8), iVar20 < 0)) {
                  if ((fpclass_type)local_6b0 == cpp_dec_float_NaN) {
LAB_0037f70e:
                    pSVar28 = (SPxOut *)pVVar1;
                  }
                  else {
                    local_5c0._0_4_ = cpp_dec_float_finite;
                    local_5c0._4_4_ = 0x10;
                    local_608 = (undefined1  [16])0x0;
                    local_5f8 = (undefined1  [16])0x0;
                    local_5e8 = (undefined1  [16])0x0;
                    local_5d8 = (_func_int *)0x0;
                    _uStack_5d0 = 0;
                    uStack_5cb = 0;
                    iStack_5c8 = 0;
                    bStack_5c4 = false;
                    iVar20 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::
                             compare((cpp_dec_float<100U,_int,_void> *)local_6f8,
                                     (cpp_dec_float<100U,_int,_void> *)local_608);
                    pSVar28 = local_650;
                    if (iVar20 < 0) goto LAB_0037f70e;
                  }
                  boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator+=
                            ((cpp_dec_float<100U,_int,_void> *)(pSVar28->_vptr_SPxOut + uVar26 * 10)
                             ,(cpp_dec_float<100U,_int,_void> *)local_6f8);
                  goto LAB_0037ebfc;
                }
              }
              pcVar24 = &(pVVar1->val).
                         super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                         ._M_impl.super__Vector_impl_data._M_start[uVar26].m_backend;
              ::soplex::infinity::__tls_init();
              local_5c0._0_4_ = cpp_dec_float_finite;
              local_5c0._4_4_ = 0x10;
              local_608 = (undefined1  [16])0x0;
              local_5f8 = (undefined1  [16])0x0;
              local_5e8 = (undefined1  [16])0x0;
              local_5d8 = (_func_int *)0x0;
              _uStack_5d0 = 0;
              uStack_5cb = 0;
              iStack_5c8 = 0;
              bStack_5c4 = false;
              boost::multiprecision::backends::cpp_dec_float<100u,int,void>::operator=
                        ((cpp_dec_float<100u,int,void> *)local_608,(double)local_638);
              if (((pcVar24->fpclass == cpp_dec_float_NaN) ||
                  ((fpclass_type)local_5c0 == cpp_dec_float_NaN)) ||
                 (iVar20 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::compare
                                     (pcVar24,(cpp_dec_float<100U,_int,_void> *)local_608),
                 iVar20 < 1)) {
                pcVar24 = (cpp_dec_float<100U,_int,_void> *)(local_650->_vptr_SPxOut + uVar26 * 10);
                local_678 = local_6c8;
                _uStack_670 = _uStack_6c0;
                uStack_66b = uStack_6bb;
                local_688 = local_6d8;
                local_698 = local_6e8;
                local_6a8 = local_6f8;
                auVar16 = local_6a8;
                iStack_668 = iStack_6b8;
                bStack_664 = bStack_6b4;
                local_660._0_4_ = (fpclass_type)local_6b0;
                local_660._4_4_ = local_6b0._4_4_;
                if ((bStack_6b4 == true) &&
                   (local_6a8._0_4_ = local_6f8._0_4_,
                   (fpclass_type)local_6b0 != cpp_dec_float_finite || local_6a8._0_4_ != 0)) {
                  bStack_664 = false;
                }
                local_5c0._0_4_ = cpp_dec_float_finite;
                local_5c0._4_4_ = 0x10;
                local_608 = (undefined1  [16])0x0;
                local_5f8 = (undefined1  [16])0x0;
                local_5e8 = (undefined1  [16])0x0;
                local_5d8 = (_func_int *)0x0;
                _uStack_5d0 = 0;
                uStack_5cb = 0;
                iStack_5c8 = 0;
                bStack_5c4 = false;
                if ((cpp_dec_float<100U,_int,_void> *)local_608 != pcVar24) {
                  local_608 = *(undefined1 (*) [16])(pcVar24->data)._M_elems;
                  local_5f8 = *(undefined1 (*) [16])((pcVar24->data)._M_elems + 4);
                  local_5e8 = *(undefined1 (*) [16])((pcVar24->data)._M_elems + 8);
                  local_5d8 = *(_func_int **)((pcVar24->data)._M_elems + 0xc);
                  uVar8 = *(undefined8 *)((pcVar24->data)._M_elems + 0xe);
                  _uStack_5d0 = (undefined5)uVar8;
                  uStack_5cb = (undefined3)((ulong)uVar8 >> 0x28);
                  iStack_5c8 = pcVar24->exp;
                  bStack_5c4 = pcVar24->neg;
                  local_5c0._0_4_ = pcVar24->fpclass;
                  local_5c0._4_4_ = pcVar24->prec_elem;
                }
                local_6a8 = auVar16;
                boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator-=
                          ((cpp_dec_float<100U,_int,_void> *)local_608,
                           (cpp_dec_float<100U,_int,_void> *)local_6a8);
                pnVar27 = (pVVar1->val).
                          super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                          ._M_impl.super__Vector_impl_data._M_start;
              }
              else {
                pcVar24 = &(pVVar1->val).
                           super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                           ._M_impl.super__Vector_impl_data._M_start[uVar26].m_backend;
                local_678 = local_6c8;
                _uStack_670 = _uStack_6c0;
                uStack_66b = uStack_6bb;
                local_688 = local_6d8;
                local_698 = local_6e8;
                local_6a8 = local_6f8;
                auVar16 = local_6a8;
                iStack_668 = iStack_6b8;
                bStack_664 = bStack_6b4;
                local_660._0_4_ = (fpclass_type)local_6b0;
                local_660._4_4_ = local_6b0._4_4_;
                if ((bStack_6b4 == true) &&
                   (local_6a8._0_4_ = local_6f8._0_4_,
                   (fpclass_type)local_6b0 != cpp_dec_float_finite || local_6a8._0_4_ != 0)) {
                  bStack_664 = false;
                }
                local_5c0._0_4_ = cpp_dec_float_finite;
                local_5c0._4_4_ = 0x10;
                local_608 = (undefined1  [16])0x0;
                local_5f8 = (undefined1  [16])0x0;
                local_5e8 = (undefined1  [16])0x0;
                local_5d8 = (_func_int *)0x0;
                _uStack_5d0 = 0;
                uStack_5cb = 0;
                iStack_5c8 = 0;
                bStack_5c4 = false;
                if ((cpp_dec_float<100U,_int,_void> *)local_608 != pcVar24) {
                  local_608 = *(undefined1 (*) [16])(pcVar24->data)._M_elems;
                  local_5f8 = *(undefined1 (*) [16])((pcVar24->data)._M_elems + 4);
                  local_5e8 = *(undefined1 (*) [16])((pcVar24->data)._M_elems + 8);
                  local_5d8 = *(_func_int **)((pcVar24->data)._M_elems + 0xc);
                  uVar8 = *(undefined8 *)((pcVar24->data)._M_elems + 0xe);
                  _uStack_5d0 = (undefined5)uVar8;
                  uStack_5cb = (undefined3)((ulong)uVar8 >> 0x28);
                  iStack_5c8 = pcVar24->exp;
                  bStack_5c4 = pcVar24->neg;
                  local_5c0._0_4_ = pcVar24->fpclass;
                  local_5c0._4_4_ = pcVar24->prec_elem;
                }
                local_6a8 = auVar16;
                boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator+=
                          ((cpp_dec_float<100U,_int,_void> *)local_608,
                           (cpp_dec_float<100U,_int,_void> *)local_6a8);
                pnVar27 = (pointer)local_650->_vptr_SPxOut;
              }
              auVar16 = local_608;
              puVar3 = pnVar27[uVar26].m_backend.data._M_elems + 0xc;
              *(_func_int **)puVar3 = local_5d8;
              *(_func_int **)(puVar3 + 2) = (_func_int *)CONCAT35(uStack_5cb,_uStack_5d0);
              puVar3 = pnVar27[uVar26].m_backend.data._M_elems + 8;
              *(undefined8 *)puVar3 = local_5e8._0_8_;
              *(undefined8 *)(puVar3 + 2) = local_5e8._8_8_;
              puVar3 = pnVar27[uVar26].m_backend.data._M_elems + 4;
              *(undefined8 *)puVar3 = local_5f8._0_8_;
              *(undefined8 *)(puVar3 + 2) = local_5f8._8_8_;
              pDVar2 = (DataKey *)(pnVar27 + uVar26);
              pDVar2->info = local_608._0_4_;
              pDVar2->idx = local_608._4_4_;
              pDVar2[1].info = local_608._8_4_;
              pDVar2[1].idx = local_608._12_4_;
              pnVar27[uVar26].m_backend.exp = iStack_5c8;
              pnVar27[uVar26].m_backend.neg = bStack_5c4;
              pnVar27[uVar26].m_backend.fpclass = (fpclass_type)local_5c0;
              pnVar27[uVar26].m_backend.prec_elem = local_5c0._4_4_;
              local_608 = auVar16;
            }
          }
        }
LAB_0037ebfc:
        bVar19 = MPSInput::readLine((MPSInput *)local_390);
        if (!bVar19) goto LAB_0037f820;
      }
      if ((local_3b0 != (SPxOut *)0x0) && (3 < (int)local_3b0->m_verbosity)) {
        local_608._0_4_ = local_3b0->m_verbosity;
        local_6a8._0_4_ = 4;
        (*local_3b0->_vptr_SPxOut[2])(local_3b0);
        std::__ostream_insert<char,std::char_traits<char>>
                  (pSVar28->m_streams[pSVar28->m_verbosity],"IMPSRD04 Range name     : ",0x1a);
        poVar6 = pSVar28->m_streams[pSVar28->m_verbosity];
        sVar25 = strlen((char *)local_4c8);
        std::__ostream_insert<char,std::char_traits<char>>(poVar6,(char *)local_4c8,sVar25);
        cVar5 = (char)pSVar28->m_streams[pSVar28->m_verbosity];
        std::ios::widen((char)*(undefined8 *)
                               (*(long *)pSVar28->m_streams[pSVar28->m_verbosity] + -0x18) + cVar5);
        std::ostream::put(cVar5);
        std::ostream::flush();
        (*pSVar28->_vptr_SPxOut[2])(pSVar28,local_608);
      }
      uVar8 = local_268._0_8_;
      iVar20 = strcmp((char *)local_268._0_8_,"BOUNDS");
      if (iVar20 == 0) {
        local_390._8_4_ = BOUNDS;
        goto LAB_0037f82d;
      }
      iVar20 = strcmp((char *)uVar8,"ENDATA");
      if (iVar20 == 0) {
        local_390._8_4_ = ENDATA;
        goto LAB_0037f82d;
      }
    }
LAB_0037f820:
    MPSInput::syntaxError((MPSInput *)local_390);
  }
LAB_0037f82d:
  pNVar18 = local_648;
  if (local_390._8_4_ == BOUNDS) {
    pSVar28 = this->spxout;
    DIdxSet::DIdxSet((DIdxSet *)local_6a8,8);
    memset((DataKey *)local_4c8,0,0x100);
    local_5c0._0_4_ = cpp_dec_float_finite;
    local_5c0._4_4_ = 0x10;
    local_608 = (undefined1  [16])0x0;
    local_5f8 = (undefined1  [16])0x0;
    local_5e8 = (undefined1  [16])0x0;
    local_5d8 = (_func_int *)0x0;
    _uStack_5d0 = 0;
    uStack_5cb = 0;
    iStack_5c8 = 0;
    bStack_5c4 = false;
    local_638 = *(NameSet **)(in_FS_OFFSET + -8);
    uStack_630 = 0;
    local_628 = (NameSet *)((ulong)local_638 ^ 0x8000000000000000);
    uStack_620 = 0x8000000000000000;
LAB_0037f8dc:
    bVar19 = MPSInput::readLine((MPSInput *)local_390);
    if (bVar19) {
      if ((char *)local_268._0_8_ != (char *)0x0) {
        if ((pSVar28 != (SPxOut *)0x0) && (3 < (int)pSVar28->m_verbosity)) {
          local_6f8._0_4_ = pSVar28->m_verbosity;
          local_500._0_4_ = 4;
          (*pSVar28->_vptr_SPxOut[2])(pSVar28);
          std::__ostream_insert<char,std::char_traits<char>>
                    (pSVar28->m_streams[pSVar28->m_verbosity],"IMPSRD05 Bound name     : ",0x1a);
          poVar6 = pSVar28->m_streams[pSVar28->m_verbosity];
          sVar25 = strlen((char *)local_4c8);
          std::__ostream_insert<char,std::char_traits<char>>(poVar6,(char *)local_4c8,sVar25);
          cVar5 = (char)pSVar28->m_streams[pSVar28->m_verbosity];
          std::ios::widen((char)*(undefined8 *)
                                 (*(long *)pSVar28->m_streams[pSVar28->m_verbosity] + -0x18) + cVar5
                         );
          std::ostream::put(cVar5);
          std::ostream::flush();
          (*pSVar28->_vptr_SPxOut[2])(pSVar28,local_6f8);
        }
        iVar20 = strcmp((char *)local_268._0_8_,"ENDATA");
        if (iVar20 == 0) {
          local_390._8_4_ = ENDATA;
          goto LAB_003802e1;
        }
        goto switchD_0037fd8b_caseD_4e;
      }
      uVar8 = local_268._8_8_;
      iVar20 = strcmp((char *)local_268._8_8_,"LO");
      if ((((iVar20 == 0) || (iVar20 = strcmp((char *)uVar8,"UP"), iVar20 == 0)) ||
          (iVar20 = strcmp((char *)uVar8,"FX"), iVar20 == 0)) ||
         ((iVar20 = strcmp((char *)uVar8,"LI"), iVar20 == 0 ||
          (iVar20 = strcmp((char *)uVar8,"UI"), iVar20 == 0)))) {
        if ((char *)local_258._8_8_ != (char *)0x0) {
          pcVar23 = (char *)local_248._0_8_;
          goto joined_r0x0037f98e;
        }
      }
      else if ((char *)local_258._0_8_ != (char *)0x0) {
        pcVar23 = (char *)local_258._8_8_;
joined_r0x0037f98e:
        if (pcVar23 == (char *)0x0) {
          MPSInput::insertName((MPSInput *)local_390,"_BND_",true);
        }
      }
      if ((((char *)local_268._8_8_ == (char *)0x0) || ((char *)local_258._0_8_ == (char *)0x0)) ||
         ((char *)local_258._8_8_ == (char *)0x0)) goto switchD_0037fd8b_caseD_4e;
      if (local_4c8[0] == '\0') {
        spxSnprintf((char *)local_4c8,0x100,"%s");
      }
      iVar20 = strcmp((char *)local_4c8,(char *)local_258._0_8_);
      if (iVar20 == 0) {
        uVar22 = NameSet::number(pNVar18,(char *)local_258._8_8_);
        if ((int)uVar22 < 0) {
          MPSInput::entryIgnored
                    ((MPSInput *)local_390,"column",(char *)local_258._8_8_,"bound",
                     (char *)local_4c8);
          goto LAB_0037f8dc;
        }
        uVar8 = local_248._0_8_;
        if ((char *)local_248._0_8_ == (char *)0x0) {
          pcVar24 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::zero();
          local_608 = *(undefined1 (*) [16])(pcVar24->data)._M_elems;
          local_5f8 = *(undefined1 (*) [16])((pcVar24->data)._M_elems + 4);
          local_5e8 = *(undefined1 (*) [16])((pcVar24->data)._M_elems + 8);
          local_5d8 = *(_func_int **)((pcVar24->data)._M_elems + 0xc);
          uVar8 = *(undefined8 *)((pcVar24->data)._M_elems + 0xe);
          _uStack_5d0 = (undefined5)uVar8;
          uStack_5cb = (undefined3)((ulong)uVar8 >> 0x28);
          iStack_5c8 = pcVar24->exp;
          bStack_5c4 = pcVar24->neg;
          local_5c0._0_4_ = pcVar24->fpclass;
          local_5c0._4_4_ = pcVar24->prec_elem;
        }
        else {
          iVar20 = strcmp((char *)local_248._0_8_,"-Inf");
          if ((iVar20 == 0) || (iVar20 = strcmp((char *)uVar8,"-inf"), iVar20 == 0)) {
            ::soplex::infinity::__tls_init();
            local_6b0._0_4_ = cpp_dec_float_finite;
            local_6b0._4_4_ = 0x10;
            local_6f8 = (undefined1  [16])0x0;
            local_6e8 = (undefined1  [16])0x0;
            local_6d8 = (undefined1  [16])0x0;
            local_6c8 = (_func_int *)0x0;
            _uStack_6c0 = 0;
            uStack_6bb = 0;
            iStack_6b8 = 0;
            bStack_6b4 = false;
            boost::multiprecision::backends::cpp_dec_float<100u,int,void>::operator=
                      ((cpp_dec_float<100u,int,void> *)local_6f8,(double)local_628);
          }
          else {
            iVar20 = strcmp((char *)uVar8,"Inf");
            if ((((iVar20 != 0) && (iVar20 = strcmp((char *)uVar8,"inf"), iVar20 != 0)) &&
                (iVar20 = strcmp((char *)uVar8,"+Inf"), iVar20 != 0)) &&
               (iVar20 = strcmp((char *)uVar8,"+inf"), iVar20 != 0)) {
              dVar29 = atof((char *)uVar8);
              boost::multiprecision::backends::cpp_dec_float<100u,int,void>::operator=
                        ((cpp_dec_float<100u,int,void> *)local_608,dVar29);
              goto LAB_0037fc74;
            }
            ::soplex::infinity::__tls_init();
            local_6b0._0_4_ = cpp_dec_float_finite;
            local_6b0._4_4_ = 0x10;
            local_6f8 = (undefined1  [16])0x0;
            local_6e8 = (undefined1  [16])0x0;
            local_6d8 = (undefined1  [16])0x0;
            local_6c8 = (_func_int *)0x0;
            _uStack_6c0 = 0;
            uStack_6bb = 0;
            iStack_6b8 = 0;
            bStack_6b4 = false;
            boost::multiprecision::backends::cpp_dec_float<100u,int,void>::operator=
                      ((cpp_dec_float<100u,int,void> *)local_6f8,(double)local_638);
          }
          local_5d8 = local_6c8;
          _uStack_5d0 = _uStack_6c0;
          uStack_5cb = uStack_6bb;
          local_5e8 = local_6d8;
          local_5f8 = local_6e8;
          local_608 = local_6f8;
          iStack_5c8 = iStack_6b8;
          bStack_5c4 = bStack_6b4;
          local_5c0._0_4_ = (fpclass_type)local_6b0;
          local_5c0._4_4_ = local_6b0._4_4_;
        }
LAB_0037fc74:
        if (*(char *)(local_268._8_8_ + 1) == 'I') {
          if (local_610 != (DIdxSet *)0x0) {
            DIdxSet::addIdx(local_610,uVar22);
          }
          iVar20 = IdxSet::pos((IdxSet *)local_6a8,uVar22);
          if (iVar20 < 0) {
            ::soplex::infinity::__tls_init();
            local_6b0._0_4_ = cpp_dec_float_finite;
            local_6b0._4_4_ = 0x10;
            local_6f8 = (undefined1  [16])0x0;
            local_6e8 = (undefined1  [16])0x0;
            local_6d8 = (undefined1  [16])0x0;
            local_6c8 = (_func_int *)0x0;
            _uStack_6c0 = 0;
            uStack_6bb = 0;
            iStack_6b8 = 0;
            bStack_6b4 = false;
            boost::multiprecision::backends::cpp_dec_float<100u,int,void>::operator=
                      ((cpp_dec_float<100u,int,void> *)local_6f8,(double)local_638);
            auVar16 = local_6f8;
            pnVar27 = (this->
                      super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      ).up.val.
                      super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            puVar3 = pnVar27[uVar22].m_backend.data._M_elems + 0xc;
            *(_func_int **)puVar3 = local_6c8;
            *(ulong *)(puVar3 + 2) = CONCAT35(uStack_6bb,_uStack_6c0);
            puVar3 = pnVar27[uVar22].m_backend.data._M_elems + 8;
            *(undefined8 *)puVar3 = local_6d8._0_8_;
            *(undefined8 *)(puVar3 + 2) = local_6d8._8_8_;
            puVar3 = pnVar27[uVar22].m_backend.data._M_elems + 4;
            *(undefined8 *)puVar3 = local_6e8._0_8_;
            *(undefined8 *)(puVar3 + 2) = local_6e8._8_8_;
            pDVar2 = (DataKey *)(pnVar27 + uVar22);
            pDVar2->info = local_6f8._0_4_;
            pDVar2->idx = local_6f8._4_4_;
            pDVar2[1].info = local_6f8._8_4_;
            pDVar2[1].idx = local_6f8._12_4_;
            pnVar27[uVar22].m_backend.exp = iStack_6b8;
            pnVar27[uVar22].m_backend.neg = bStack_6b4;
            pnVar27[uVar22].m_backend.fpclass = (fpclass_type)local_6b0;
            pnVar27[uVar22].m_backend.prec_elem = local_6b0._4_4_;
            local_6f8 = auVar16;
            DIdxSet::addIdx((DIdxSet *)local_6a8,uVar22);
          }
        }
        auVar16 = local_608;
        cVar5 = *(char *)local_268._8_8_;
        switch(cVar5) {
        case 'L':
          pnVar27 = (this->
                    super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    ).low.val.
                    super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          break;
        case 'M':
          ::soplex::infinity::__tls_init();
          local_6b0._0_4_ = cpp_dec_float_finite;
          local_6b0._4_4_ = 0x10;
          local_6f8 = (undefined1  [16])0x0;
          local_6e8 = (undefined1  [16])0x0;
          local_6d8 = (undefined1  [16])0x0;
          local_6c8 = (_func_int *)0x0;
          _uStack_6c0 = 0;
          uStack_6bb = 0;
          iStack_6b8 = 0;
          bStack_6b4 = false;
          boost::multiprecision::backends::cpp_dec_float<100u,int,void>::operator=
                    ((cpp_dec_float<100u,int,void> *)local_6f8,(double)local_628);
          pnVar27 = (this->
                    super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    ).low.val.
                    super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          goto LAB_0037ff66;
        case 'N':
        case 'O':
        case 'Q':
        case 'R':
        case 'S':
        case 'T':
          goto switchD_0037fd8b_caseD_4e;
        case 'P':
          ::soplex::infinity::__tls_init();
          local_6b0._0_4_ = cpp_dec_float_finite;
          local_6b0._4_4_ = 0x10;
          local_6f8 = (undefined1  [16])0x0;
          local_6e8 = (undefined1  [16])0x0;
          local_6d8 = (undefined1  [16])0x0;
          local_6c8 = (_func_int *)0x0;
          _uStack_6c0 = 0;
          uStack_6bb = 0;
          iStack_6b8 = 0;
          bStack_6b4 = false;
          boost::multiprecision::backends::cpp_dec_float<100u,int,void>::operator=
                    ((cpp_dec_float<100u,int,void> *)local_6f8,(double)local_638);
          pnVar27 = (this->
                    super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    ).up.val.
                    super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
LAB_0037ff66:
          auVar16 = local_6f8;
          puVar3 = pnVar27[uVar22].m_backend.data._M_elems + 0xc;
          *(_func_int **)puVar3 = local_6c8;
          *(ulong *)(puVar3 + 2) = CONCAT35(uStack_6bb,_uStack_6c0);
          puVar3 = pnVar27[uVar22].m_backend.data._M_elems + 8;
          *(undefined8 *)puVar3 = local_6d8._0_8_;
          *(undefined8 *)(puVar3 + 2) = local_6d8._8_8_;
          puVar3 = pnVar27[uVar22].m_backend.data._M_elems + 4;
          *(undefined8 *)puVar3 = local_6e8._0_8_;
          *(undefined8 *)(puVar3 + 2) = local_6e8._8_8_;
          pDVar2 = (DataKey *)(pnVar27 + uVar22);
          pDVar2->info = local_6f8._0_4_;
          pDVar2->idx = local_6f8._4_4_;
          pDVar2[1].info = local_6f8._8_4_;
          pDVar2[1].idx = local_6f8._12_4_;
          pnVar27[uVar22].m_backend.exp = iStack_6b8;
          pnVar27[uVar22].m_backend.neg = bStack_6b4;
          pnVar27[uVar22].m_backend.fpclass = (fpclass_type)local_6b0;
          pnVar27[uVar22].m_backend.prec_elem = local_6b0._4_4_;
          local_6f8 = auVar16;
          goto LAB_0037f8dc;
        case 'U':
          pnVar27 = (this->
                    super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    ).up.val.
                    super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          break;
        default:
          if (cVar5 == 'B') {
            pnVar27 = (this->
                      super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      ).low.val.
                      super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            pcVar24 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::zero();
            uVar8 = *(undefined8 *)(pcVar24->data)._M_elems;
            uVar9 = *(undefined8 *)((pcVar24->data)._M_elems + 2);
            uVar10 = *(undefined8 *)((pcVar24->data)._M_elems + 4);
            uVar11 = *(undefined8 *)((pcVar24->data)._M_elems + 6);
            uVar12 = *(undefined8 *)((pcVar24->data)._M_elems + 8);
            uVar13 = *(undefined8 *)((pcVar24->data)._M_elems + 10);
            uVar14 = *(undefined8 *)((pcVar24->data)._M_elems + 0xe);
            puVar3 = pnVar27[uVar22].m_backend.data._M_elems + 0xc;
            *(undefined8 *)puVar3 = *(undefined8 *)((pcVar24->data)._M_elems + 0xc);
            *(undefined8 *)(puVar3 + 2) = uVar14;
            puVar3 = pnVar27[uVar22].m_backend.data._M_elems + 8;
            *(undefined8 *)puVar3 = uVar12;
            *(undefined8 *)(puVar3 + 2) = uVar13;
            puVar3 = pnVar27[uVar22].m_backend.data._M_elems + 4;
            *(undefined8 *)puVar3 = uVar10;
            *(undefined8 *)(puVar3 + 2) = uVar11;
            *(undefined8 *)&pnVar27[uVar22].m_backend.data = uVar8;
            *(undefined8 *)(pnVar27[uVar22].m_backend.data._M_elems + 2) = uVar9;
            pnVar27[uVar22].m_backend.exp = pcVar24->exp;
            pnVar27[uVar22].m_backend.neg = pcVar24->neg;
            iVar15 = pcVar24->prec_elem;
            pnVar27[uVar22].m_backend.fpclass = pcVar24->fpclass;
            pnVar27[uVar22].m_backend.prec_elem = iVar15;
            pnVar27 = (this->
                      super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      ).up.val.
                      super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            pcVar24 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::one();
            uVar10 = *(undefined8 *)(pcVar24->data)._M_elems;
            uVar11 = *(undefined8 *)((pcVar24->data)._M_elems + 2);
            uVar8 = *(undefined8 *)((pcVar24->data)._M_elems + 4);
            uVar9 = *(undefined8 *)((pcVar24->data)._M_elems + 6);
            uVar12 = *(undefined8 *)((pcVar24->data)._M_elems + 8);
            uVar13 = *(undefined8 *)((pcVar24->data)._M_elems + 10);
            uVar14 = *(undefined8 *)((pcVar24->data)._M_elems + 0xe);
            puVar3 = pnVar27[uVar22].m_backend.data._M_elems + 0xc;
            *(undefined8 *)puVar3 = *(undefined8 *)((pcVar24->data)._M_elems + 0xc);
            *(undefined8 *)(puVar3 + 2) = uVar14;
            puVar3 = pnVar27[uVar22].m_backend.data._M_elems + 8;
            *(undefined8 *)puVar3 = uVar12;
            *(undefined8 *)(puVar3 + 2) = uVar13;
            puVar3 = pnVar27[uVar22].m_backend.data._M_elems + 4;
            *(undefined8 *)puVar3 = uVar8;
            *(undefined8 *)(puVar3 + 2) = uVar9;
            *(undefined8 *)&pnVar27[uVar22].m_backend.data = uVar10;
            *(undefined8 *)(pnVar27[uVar22].m_backend.data._M_elems + 2) = uVar11;
            pnVar27[uVar22].m_backend.exp = pcVar24->exp;
            pnVar27[uVar22].m_backend.neg = pcVar24->neg;
            iVar15 = pcVar24->prec_elem;
            pnVar27[uVar22].m_backend.fpclass = pcVar24->fpclass;
            pnVar27[uVar22].m_backend.prec_elem = iVar15;
            if (local_610 != (DIdxSet *)0x0) {
              DIdxSet::addIdx(local_610,uVar22);
            }
            goto LAB_0037f8dc;
          }
          if (cVar5 != 'F') goto switchD_0037fd8b_caseD_4e;
          if (*(char *)(local_268._8_8_ + 1) != 'X') {
            ::soplex::infinity::__tls_init();
            local_6b0._0_4_ = cpp_dec_float_finite;
            local_6b0._4_4_ = 0x10;
            local_6f8 = (undefined1  [16])0x0;
            local_6e8 = (undefined1  [16])0x0;
            local_6d8 = (undefined1  [16])0x0;
            local_6c8 = (_func_int *)0x0;
            _uStack_6c0 = 0;
            uStack_6bb = 0;
            iStack_6b8 = 0;
            bStack_6b4 = false;
            boost::multiprecision::backends::cpp_dec_float<100u,int,void>::operator=
                      ((cpp_dec_float<100u,int,void> *)local_6f8,(double)local_628);
            auVar16 = local_6f8;
            pnVar27 = (this->
                      super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      ).low.val.
                      super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            puVar3 = pnVar27[uVar22].m_backend.data._M_elems + 0xc;
            *(_func_int **)puVar3 = local_6c8;
            *(ulong *)(puVar3 + 2) = CONCAT35(uStack_6bb,_uStack_6c0);
            puVar3 = pnVar27[uVar22].m_backend.data._M_elems + 8;
            *(undefined8 *)puVar3 = local_6d8._0_8_;
            *(undefined8 *)(puVar3 + 2) = local_6d8._8_8_;
            puVar3 = pnVar27[uVar22].m_backend.data._M_elems + 4;
            *(undefined8 *)puVar3 = local_6e8._0_8_;
            *(undefined8 *)(puVar3 + 2) = local_6e8._8_8_;
            pDVar2 = (DataKey *)(pnVar27 + uVar22);
            pDVar2->info = local_6f8._0_4_;
            pDVar2->idx = local_6f8._4_4_;
            pDVar2[1].info = local_6f8._8_4_;
            pDVar2[1].idx = local_6f8._12_4_;
            pnVar27[uVar22].m_backend.exp = iStack_6b8;
            pnVar27[uVar22].m_backend.neg = bStack_6b4;
            pnVar27[uVar22].m_backend.fpclass = (fpclass_type)local_6b0;
            pnVar27[uVar22].m_backend.prec_elem = local_6b0._4_4_;
            local_6f8 = auVar16;
            ::soplex::infinity::__tls_init();
            local_6b0._0_4_ = cpp_dec_float_finite;
            local_6b0._4_4_ = 0x10;
            local_6f8 = (undefined1  [16])0x0;
            local_6e8 = (undefined1  [16])0x0;
            local_6d8 = (undefined1  [16])0x0;
            local_6c8 = (_func_int *)0x0;
            _uStack_6c0 = 0;
            uStack_6bb = 0;
            iStack_6b8 = 0;
            bStack_6b4 = false;
            boost::multiprecision::backends::cpp_dec_float<100u,int,void>::operator=
                      ((cpp_dec_float<100u,int,void> *)local_6f8,(double)local_638);
            auVar16 = local_6f8;
            pnVar27 = (this->
                      super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      ).up.val.
                      super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            puVar3 = pnVar27[uVar22].m_backend.data._M_elems + 0xc;
            *(_func_int **)puVar3 = local_6c8;
            *(ulong *)(puVar3 + 2) = CONCAT35(uStack_6bb,_uStack_6c0);
            puVar3 = pnVar27[uVar22].m_backend.data._M_elems + 8;
            *(undefined8 *)puVar3 = local_6d8._0_8_;
            *(undefined8 *)(puVar3 + 2) = local_6d8._8_8_;
            puVar3 = pnVar27[uVar22].m_backend.data._M_elems + 4;
            *(undefined8 *)puVar3 = local_6e8._0_8_;
            *(undefined8 *)(puVar3 + 2) = local_6e8._8_8_;
            pDVar2 = (DataKey *)(pnVar27 + uVar22);
            pDVar2->info = local_6f8._0_4_;
            pDVar2->idx = local_6f8._4_4_;
            pDVar2[1].info = local_6f8._8_4_;
            pDVar2[1].idx = local_6f8._12_4_;
            pnVar27[uVar22].m_backend.exp = iStack_6b8;
            pnVar27[uVar22].m_backend.neg = bStack_6b4;
            pnVar27[uVar22].m_backend.fpclass = (fpclass_type)local_6b0;
            pnVar27[uVar22].m_backend.prec_elem = local_6b0._4_4_;
            local_6f8 = auVar16;
            goto LAB_0037f8dc;
          }
          pnVar27 = (this->
                    super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    ).low.val.
                    super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          puVar3 = pnVar27[uVar22].m_backend.data._M_elems + 0xc;
          *(_func_int **)puVar3 = local_5d8;
          *(ulong *)(puVar3 + 2) = CONCAT35(uStack_5cb,_uStack_5d0);
          puVar3 = pnVar27[uVar22].m_backend.data._M_elems + 8;
          *(undefined8 *)puVar3 = local_5e8._0_8_;
          *(undefined8 *)(puVar3 + 2) = local_5e8._8_8_;
          puVar3 = pnVar27[uVar22].m_backend.data._M_elems + 4;
          *(undefined8 *)puVar3 = local_5f8._0_8_;
          *(undefined8 *)(puVar3 + 2) = local_5f8._8_8_;
          pDVar2 = (DataKey *)(pnVar27 + uVar22);
          pDVar2->info = local_608._0_4_;
          pDVar2->idx = local_608._4_4_;
          pDVar2[1].info = local_608._8_4_;
          pDVar2[1].idx = local_608._12_4_;
          pnVar27[uVar22].m_backend.exp = iStack_5c8;
          pnVar27[uVar22].m_backend.neg = bStack_5c4;
          pnVar27[uVar22].m_backend.fpclass = (fpclass_type)local_5c0;
          pnVar27[uVar22].m_backend.prec_elem = local_5c0._4_4_;
          pnVar27 = (this->
                    super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    ).up.val.
                    super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
        }
        puVar4 = (undefined8 *)(pnVar27[uVar22].m_backend.data._M_elems + 0xc);
        *puVar4 = local_5d8;
        puVar4[1] = CONCAT35(uStack_5cb,_uStack_5d0);
        puVar3 = pnVar27[uVar22].m_backend.data._M_elems + 8;
        *(undefined8 *)puVar3 = local_5e8._0_8_;
        *(undefined8 *)(puVar3 + 2) = local_5e8._8_8_;
        puVar3 = pnVar27[uVar22].m_backend.data._M_elems + 4;
        *(undefined8 *)puVar3 = local_5f8._0_8_;
        *(undefined8 *)(puVar3 + 2) = local_5f8._8_8_;
        pDVar2 = (DataKey *)(pnVar27 + uVar22);
        pDVar2->info = local_608._0_4_;
        pDVar2->idx = local_608._4_4_;
        pDVar2[1].info = local_608._8_4_;
        pDVar2[1].idx = local_608._12_4_;
        pnVar27[uVar22].m_backend.exp = iStack_5c8;
        pnVar27[uVar22].m_backend.neg = bStack_5c4;
        *(undefined8 *)&pnVar27[uVar22].m_backend.fpclass = local_5c0;
        local_608 = auVar16;
      }
      goto LAB_0037f8dc;
    }
switchD_0037fd8b_caseD_4e:
    MPSInput::syntaxError((MPSInput *)local_390);
LAB_003802e1:
    DIdxSet::~DIdxSet((DIdxSet *)local_6a8);
  }
  if (local_390._8_4_ != ENDATA) {
    MPSInput::syntaxError((MPSInput *)local_390);
  }
  if ((bool)local_390[0x20] == true) {
    (*(this->
      super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ).
      super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      .
      super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
      ._vptr_ClassArray[0x1b])();
  }
  else {
    (*(this->
      super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ).
      super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      .
      super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
      ._vptr_ClassArray[0x45])
              (this,(ulong)(((local_390._28_4_ != MINIMIZE) - 1) +
                           (uint)(local_390._28_4_ != MINIMIZE)));
    pSVar28 = this->spxout;
    if ((pSVar28 != (SPxOut *)0x0) && (3 < (int)pSVar28->m_verbosity)) {
      local_4c8._0_4_ = pSVar28->m_verbosity;
      local_608._0_4_ = 4;
      (*pSVar28->_vptr_SPxOut[2])();
      pSVar28 = this->spxout;
      std::__ostream_insert<char,std::char_traits<char>>
                (pSVar28->m_streams[pSVar28->m_verbosity],"IMPSRD06 Objective sense: ",0x1a);
      pcVar23 = "Maximize\n";
      if (local_390._28_4_ == MINIMIZE) {
        pcVar23 = "Minimize\n";
      }
      std::__ostream_insert<char,std::char_traits<char>>
                (pSVar28->m_streams[pSVar28->m_verbosity],pcVar23,9);
      (*this->spxout->_vptr_SPxOut[2])(this->spxout,(DataKey *)local_4c8);
    }
    added2Set(this,(SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    *)this,
              &local_4e0->
               super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ,(this->
               super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).
               super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               .set.thenum);
    (*(this->
      super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ).
      super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      .
      super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
      ._vptr_ClassArray[0x51])
              (this,(ulong)(uint)(this->
                                 super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                 ).
                                 super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                 .set.thenum);
  }
  if (local_4d8 == (NameSet *)0x0) {
    NameSet::~NameSet(local_648);
    free(local_648);
    local_648 = (NameSet *)0x0;
  }
  if (local_4d0 == (NameSet *)0x0) {
    NameSet::~NameSet(local_640);
    free(local_640);
  }
  return (bool)(local_390[0x20] ^ 1);
}

Assistant:

inline
bool SPxLPBase<R>::readMPS(
   std::istream& p_input,           ///< input stream.
   NameSet*      p_rnames,          ///< row names.
   NameSet*      p_cnames,          ///< column names.
   DIdxSet*      p_intvars)         ///< integer variables.
{
   LPRowSetBase<R>& rset = *this;
   LPColSetBase<R>& cset = *this;
   NameSet* rnames;
   NameSet* cnames;

   if(p_cnames)
      cnames = p_cnames;
   else
   {
      cnames = nullptr;
      spx_alloc(cnames);
      cnames = new(cnames) NameSet();
   }

   cnames->clear();

   if(p_rnames)
      rnames = p_rnames;
   else
   {
      try
      {
         rnames = nullptr;
         spx_alloc(rnames);
         rnames = new(rnames) NameSet();
      }
      catch(const SPxMemoryException& x)
      {
         if(!p_cnames)
         {
            cnames->~NameSet();
            spx_free(cnames);
         }

         throw x;
      }
   }

   rnames->clear();

   SPxLPBase<R>::clear(); // clear the LP.

   cset.memRemax(Init_NZos);
   cset.reMax(Init_Cols);

   MPSInput mps(p_input);

   MPSreadName(mps, spxout);

   if(mps.section() == MPSInput::OBJSEN)
      MPSreadObjsen(mps);

   if(mps.section() == MPSInput::OBJNAME)
      MPSreadObjname(mps);

   if(mps.section() == MPSInput::ROWS)
      MPSreadRows(mps, rset, *rnames, spxout);

   addedRows(rset.num());

   if(mps.section() == MPSInput::COLUMNS)
      MPSreadCols(mps, rset, *rnames, cset, *cnames, p_intvars);

   if(mps.section() == MPSInput::RHS)
      MPSreadRhs(mps, rset, *rnames, spxout);

   if(mps.section() == MPSInput::RANGES)
      MPSreadRanges(mps, rset, *rnames, spxout);

   if(mps.section() == MPSInput::BOUNDS)
      MPSreadBounds(mps, cset, *cnames, p_intvars, spxout);

   if(mps.section() != MPSInput::ENDATA)
      mps.syntaxError();

   if(mps.hasError())
      clear();
   else
   {
      changeSense(mps.objSense() == MPSInput::MINIMIZE ? SPxLPBase<R>::MINIMIZE : SPxLPBase<R>::MAXIMIZE);

      SPX_MSG_INFO2((*spxout), (*spxout) << "IMPSRD06 Objective sense: " << ((mps.objSense() ==
                    MPSInput::MINIMIZE) ? "Minimize\n" : "Maximize\n"));

      added2Set(
         *(reinterpret_cast<SVSetBase<R>*>(static_cast<LPRowSetBase<R>*>(this))),
         *(reinterpret_cast<SVSetBase<R>*>(static_cast<LPColSetBase<R>*>(this))),
         cset.num());
      addedCols(cset.num());

      assert(isConsistent());
   }

   if(p_cnames == nullptr)
   {
      cnames->~NameSet();
      spx_free(cnames);
   }

   if(p_rnames == nullptr)
   {
      rnames->~NameSet();
      spx_free(rnames);
   }

   return !mps.hasError();
}